

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O2

void aom_lpf_horizontal_14_quad_sse2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  bool bVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  unkuint9 Var101;
  undefined1 auVar102 [11];
  undefined1 auVar103 [15];
  unkuint9 Var104;
  undefined1 auVar105 [11];
  undefined1 auVar106 [15];
  unkuint9 Var107;
  undefined1 auVar108 [11];
  undefined1 auVar109 [15];
  unkuint9 Var110;
  undefined1 auVar111 [11];
  undefined1 auVar112 [15];
  unkuint9 Var113;
  undefined1 auVar114 [11];
  undefined1 auVar115 [15];
  unkuint9 Var116;
  undefined1 auVar117 [11];
  undefined1 auVar118 [15];
  unkuint9 Var119;
  undefined1 auVar120 [11];
  undefined1 auVar121 [15];
  unkuint9 Var122;
  undefined1 auVar123 [11];
  undefined1 auVar124 [15];
  undefined1 auVar125 [11];
  undefined1 auVar126 [15];
  undefined1 auVar127 [11];
  undefined1 auVar128 [15];
  undefined1 auVar129 [11];
  undefined1 auVar130 [15];
  undefined1 auVar131 [11];
  undefined1 auVar132 [15];
  undefined1 auVar133 [11];
  undefined1 auVar134 [15];
  undefined1 auVar135 [11];
  undefined1 auVar136 [15];
  undefined1 auVar137 [15];
  undefined1 auVar138 [15];
  undefined1 auVar139 [15];
  undefined1 auVar140 [15];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [15];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined1 auVar160 [15];
  undefined1 auVar161 [15];
  undefined1 auVar162 [15];
  undefined1 auVar163 [15];
  long lVar164;
  long lVar165;
  long lVar166;
  byte bVar167;
  byte bVar180;
  ushort uVar168;
  byte bVar181;
  byte bVar185;
  ushort uVar182;
  byte bVar186;
  byte bVar189;
  ushort uVar187;
  byte bVar190;
  byte bVar193;
  ushort uVar191;
  byte bVar194;
  byte bVar198;
  ushort uVar195;
  byte bVar199;
  byte bVar203;
  ushort uVar200;
  byte bVar204;
  byte bVar210;
  ushort uVar205;
  byte bVar211;
  undefined1 auVar171 [16];
  byte bVar213;
  ushort uVar212;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  short sVar188;
  short sVar192;
  short sVar196;
  short sVar201;
  ushort uVar202;
  short sVar206;
  undefined1 auVar175 [16];
  ushort uVar169;
  ushort uVar197;
  ushort uVar207;
  undefined1 auVar176 [16];
  ushort uVar183;
  ushort uVar208;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  ushort uVar170;
  ushort uVar184;
  ushort uVar209;
  undefined1 auVar179 [16];
  short sVar214;
  short sVar215;
  short sVar216;
  short sVar217;
  short sVar218;
  ushort uVar219;
  short sVar220;
  ushort uVar221;
  ushort uVar222;
  ushort uVar223;
  short sVar225;
  ushort uVar226;
  short sVar227;
  short sVar228;
  short sVar229;
  short sVar230;
  ushort uVar231;
  short sVar232;
  undefined1 auVar224 [16];
  ushort uVar233;
  byte bVar234;
  byte bVar237;
  ushort uVar235;
  byte bVar238;
  byte bVar239;
  byte bVar240;
  byte bVar241;
  byte bVar242;
  byte bVar243;
  byte bVar244;
  byte bVar245;
  byte bVar246;
  byte bVar247;
  byte bVar248;
  byte bVar249;
  byte bVar250;
  undefined1 auVar236 [16];
  byte bVar251;
  ushort uVar252;
  ushort uVar253;
  short sVar256;
  short sVar257;
  short sVar258;
  short sVar259;
  short sVar260;
  short sVar261;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  short sVar262;
  byte bVar263;
  ushort uVar264;
  byte bVar269;
  byte bVar270;
  byte bVar271;
  byte bVar272;
  byte bVar273;
  byte bVar274;
  byte bVar275;
  byte bVar276;
  byte bVar277;
  byte bVar278;
  byte bVar279;
  byte bVar280;
  byte bVar281;
  byte bVar282;
  byte bVar283;
  byte bVar284;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  short sVar286;
  short sVar287;
  short sVar288;
  short sVar289;
  short sVar290;
  short sVar291;
  ushort uVar292;
  undefined1 auVar285 [16];
  short sVar294;
  short sVar295;
  short sVar296;
  short sVar297;
  short sVar298;
  short sVar299;
  undefined1 auVar293 [16];
  ushort uVar300;
  ushort uVar301;
  short sVar304;
  ushort uVar305;
  ushort uVar306;
  short sVar307;
  ushort uVar308;
  ushort uVar309;
  short sVar310;
  ushort uVar311;
  ushort uVar312;
  short sVar313;
  ushort uVar314;
  ushort uVar315;
  short sVar316;
  ushort uVar317;
  ushort uVar318;
  short sVar319;
  ushort uVar320;
  ushort uVar321;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  short sVar322;
  ushort uVar323;
  ushort uVar324;
  ushort uVar325;
  short sVar326;
  short sVar327;
  short sVar328;
  short sVar329;
  short sVar330;
  short sVar331;
  short sVar332;
  ushort uVar334;
  ushort uVar335;
  ushort uVar336;
  undefined1 auVar333 [16];
  ushort uVar337;
  short sVar342;
  short sVar344;
  short sVar346;
  short sVar348;
  short sVar350;
  short sVar352;
  byte bVar354;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  ushort uVar338;
  ushort uVar343;
  ushort uVar345;
  ushort uVar347;
  ushort uVar349;
  ushort uVar351;
  ushort uVar353;
  byte bVar357;
  short sVar355;
  ushort uVar356;
  undefined1 auVar341 [16];
  ushort uVar358;
  undefined1 auVar359 [16];
  ushort uVar360;
  ushort uVar361;
  ushort uVar362;
  ushort uVar364;
  undefined1 auVar363 [16];
  ushort uVar365;
  ushort uVar366;
  ushort uVar367;
  ushort uVar368;
  ushort uVar370;
  ushort uVar371;
  ushort uVar372;
  ushort uVar373;
  ushort uVar374;
  ushort uVar375;
  ushort uVar376;
  ushort uVar377;
  ushort uVar378;
  ushort uVar379;
  ushort uVar380;
  ushort uVar381;
  ushort uVar382;
  ushort uVar383;
  undefined1 auVar369 [16];
  ushort uStack_2c6;
  ushort uStack_2c4;
  ushort uStack_2c2;
  ushort uStack_2c0;
  ushort uStack_2be;
  ushort uStack_2bc;
  ushort uStack_2ba;
  ushort uStack_2b6;
  ushort uStack_2b4;
  ushort uStack_2b2;
  ushort uStack_2b0;
  ushort uStack_2ae;
  ushort uStack_2ac;
  ushort uStack_2aa;
  ushort uStack_2a6;
  ushort uStack_2a4;
  ushort uStack_2a2;
  undefined2 uStack_2a0;
  undefined2 uStack_29e;
  undefined2 uStack_29c;
  undefined2 uStack_29a;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  ushort uStack_256;
  ushort uStack_254;
  ushort uStack_252;
  ushort uStack_250;
  ushort uStack_24e;
  ushort uStack_24c;
  ushort uStack_24a;
  ushort uStack_246;
  ushort uStack_244;
  ushort uStack_242;
  ushort uStack_240;
  ushort uStack_23e;
  ushort uStack_23c;
  ushort uStack_23a;
  ushort uStack_236;
  ushort uStack_234;
  ushort uStack_232;
  ushort uStack_230;
  ushort uStack_22e;
  ushort uStack_22c;
  ushort uStack_22a;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  ushort uStack_1e6;
  ushort uStack_1e4;
  ushort uStack_1e2;
  ushort uStack_1e0;
  ushort uStack_1de;
  ushort uStack_1dc;
  ushort uStack_1da;
  ushort uStack_1d6;
  ushort uStack_1d4;
  ushort uStack_1d2;
  ushort uStack_1d0;
  ushort uStack_1ce;
  ushort uStack_1cc;
  ushort uStack_1ca;
  ushort uStack_196;
  ushort uStack_194;
  ushort uStack_192;
  ushort uStack_190;
  ushort uStack_18e;
  ushort uStack_18c;
  ushort uStack_18a;
  ushort uStack_186;
  ushort uStack_184;
  ushort uStack_182;
  ushort uStack_180;
  ushort uStack_17e;
  ushort uStack_17c;
  ushort uStack_17a;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ushort uStack_136;
  ushort uStack_134;
  ushort uStack_132;
  ushort uStack_130;
  ushort uStack_12e;
  ushort uStack_12c;
  ushort uStack_12a;
  ushort uStack_f6;
  ushort uStack_f4;
  ushort uStack_f2;
  ushort uStack_f0;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  ushort uStack_80;
  ushort uStack_7e;
  ushort uStack_7c;
  ushort uStack_7a;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  
  lVar166 = (long)p;
  auVar175 = *(undefined1 (*) [16])(s + lVar166 * -4);
  auVar176 = *(undefined1 (*) [16])(s + lVar166 * -3);
  auVar293 = *(undefined1 (*) [16])(s + lVar166 * -2);
  auVar177 = *(undefined1 (*) [16])(s + -lVar166);
  auVar172 = *(undefined1 (*) [16])s;
  auVar173 = *(undefined1 (*) [16])(s + lVar166);
  auVar174 = *(undefined1 (*) [16])(s + lVar166 * 2);
  auVar179 = *(undefined1 (*) [16])(s + lVar166 * 3);
  auVar171 = psubusb(auVar293,auVar177);
  auVar224 = psubusb(auVar177,auVar293);
  auVar224 = auVar224 | auVar171;
  auVar236 = psubusb(auVar173,auVar172);
  auVar171 = psubusb(auVar172,auVar173);
  auVar171 = auVar171 | auVar236;
  bVar283 = auVar224[0];
  bVar234 = auVar171[0];
  bVar167 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[1];
  bVar234 = auVar171[1];
  bVar180 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[2];
  bVar234 = auVar171[2];
  bVar181 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[3];
  bVar234 = auVar171[3];
  bVar185 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[4];
  bVar234 = auVar171[4];
  bVar186 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[5];
  bVar234 = auVar171[5];
  bVar189 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[6];
  bVar234 = auVar171[6];
  bVar190 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[7];
  bVar234 = auVar171[7];
  bVar193 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[8];
  bVar234 = auVar171[8];
  bVar194 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[9];
  bVar234 = auVar171[9];
  bVar198 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[10];
  bVar234 = auVar171[10];
  bVar199 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[0xb];
  bVar234 = auVar171[0xb];
  bVar203 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[0xc];
  bVar234 = auVar171[0xc];
  bVar204 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[0xd];
  bVar234 = auVar171[0xd];
  bVar210 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[0xe];
  bVar234 = auVar171[0xe];
  bVar237 = auVar171[0xf];
  bVar211 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[0xf];
  bVar213 = (bVar237 < bVar283) * bVar283 | (bVar237 >= bVar283) * bVar237;
  auVar171 = psubusb(auVar177,auVar172);
  auVar236 = psubusb(auVar172,auVar177);
  auVar224 = psubusb(auVar293,auVar173);
  auVar254 = psubusb(auVar173,auVar293);
  auVar254 = auVar254 | auVar224;
  auVar171 = paddusb(auVar236 | auVar171,auVar236 | auVar171);
  auVar224._0_2_ = auVar254._0_2_ >> 1;
  auVar224._2_2_ = auVar254._2_2_ >> 1;
  auVar224._4_2_ = auVar254._4_2_ >> 1;
  auVar224._6_2_ = auVar254._6_2_ >> 1;
  auVar224._8_2_ = auVar254._8_2_ >> 1;
  auVar224._10_2_ = auVar254._10_2_ >> 1;
  auVar224._12_2_ = auVar254._12_2_ >> 1;
  auVar224._14_2_ = auVar254._14_2_ >> 1;
  auVar171 = paddusb(auVar224 & _DAT_0042b850,auVar171);
  bVar251 = *_blimit0;
  bVar263 = _blimit0[1];
  bVar269 = _blimit0[2];
  bVar270 = _blimit0[3];
  bVar271 = _blimit0[4];
  bVar272 = _blimit0[5];
  bVar273 = _blimit0[6];
  bVar274 = _blimit0[7];
  bVar275 = _blimit0[8];
  bVar276 = _blimit0[9];
  bVar277 = _blimit0[10];
  bVar278 = _blimit0[0xb];
  bVar279 = _blimit0[0xc];
  bVar280 = _blimit0[0xd];
  bVar281 = _blimit0[0xe];
  bVar282 = _blimit0[0xf];
  bVar283 = auVar171[0];
  bVar234 = auVar171[1];
  bVar237 = auVar171[2];
  bVar238 = auVar171[3];
  bVar239 = auVar171[4];
  bVar240 = auVar171[5];
  bVar241 = auVar171[6];
  bVar242 = auVar171[7];
  bVar243 = auVar171[8];
  bVar244 = auVar171[9];
  bVar245 = auVar171[10];
  bVar246 = auVar171[0xb];
  bVar247 = auVar171[0xc];
  bVar248 = auVar171[0xd];
  bVar249 = auVar171[0xe];
  bVar250 = auVar171[0xf];
  bVar283 = -((byte)((bVar283 < bVar251) * bVar283 | (bVar283 >= bVar251) * bVar251) == bVar283) ^
            0xff;
  bVar251 = -((byte)((bVar234 < bVar263) * bVar234 | (bVar234 >= bVar263) * bVar263) == bVar234) ^
            0xff;
  bVar263 = -((byte)((bVar237 < bVar269) * bVar237 | (bVar237 >= bVar269) * bVar269) == bVar237) ^
            0xff;
  bVar269 = -((byte)((bVar238 < bVar270) * bVar238 | (bVar238 >= bVar270) * bVar270) == bVar238) ^
            0xff;
  bVar270 = -((byte)((bVar239 < bVar271) * bVar239 | (bVar239 >= bVar271) * bVar271) == bVar239) ^
            0xff;
  bVar271 = -((byte)((bVar240 < bVar272) * bVar240 | (bVar240 >= bVar272) * bVar272) == bVar240) ^
            0xff;
  bVar272 = -((byte)((bVar241 < bVar273) * bVar241 | (bVar241 >= bVar273) * bVar273) == bVar241) ^
            0xff;
  bVar273 = -((byte)((bVar242 < bVar274) * bVar242 | (bVar242 >= bVar274) * bVar274) == bVar242) ^
            0xff;
  bVar274 = -((byte)((bVar243 < bVar275) * bVar243 | (bVar243 >= bVar275) * bVar275) == bVar243) ^
            0xff;
  bVar275 = -((byte)((bVar244 < bVar276) * bVar244 | (bVar244 >= bVar276) * bVar276) == bVar244) ^
            0xff;
  bVar276 = -((byte)((bVar245 < bVar277) * bVar245 | (bVar245 >= bVar277) * bVar277) == bVar245) ^
            0xff;
  bVar277 = -((byte)((bVar246 < bVar278) * bVar246 | (bVar246 >= bVar278) * bVar278) == bVar246) ^
            0xff;
  bVar278 = -((byte)((bVar247 < bVar279) * bVar247 | (bVar247 >= bVar279) * bVar279) == bVar247) ^
            0xff;
  bVar279 = -((byte)((bVar248 < bVar280) * bVar248 | (bVar248 >= bVar280) * bVar280) == bVar248) ^
            0xff;
  bVar280 = -((byte)((bVar249 < bVar281) * bVar249 | (bVar249 >= bVar281) * bVar281) == bVar249) ^
            0xff;
  bVar281 = -((byte)((bVar250 < bVar282) * bVar250 | (bVar250 >= bVar282) * bVar282) == bVar250) ^
            0xff;
  bVar234 = (bVar283 < bVar167) * bVar167 | (bVar283 >= bVar167) * bVar283;
  bVar237 = (bVar251 < bVar180) * bVar180 | (bVar251 >= bVar180) * bVar251;
  bVar238 = (bVar263 < bVar181) * bVar181 | (bVar263 >= bVar181) * bVar263;
  bVar239 = (bVar269 < bVar185) * bVar185 | (bVar269 >= bVar185) * bVar269;
  bVar240 = (bVar270 < bVar186) * bVar186 | (bVar270 >= bVar186) * bVar270;
  bVar241 = (bVar271 < bVar189) * bVar189 | (bVar271 >= bVar189) * bVar271;
  bVar242 = (bVar272 < bVar190) * bVar190 | (bVar272 >= bVar190) * bVar272;
  bVar243 = (bVar273 < bVar193) * bVar193 | (bVar273 >= bVar193) * bVar273;
  bVar244 = (bVar274 < bVar194) * bVar194 | (bVar274 >= bVar194) * bVar274;
  bVar245 = (bVar275 < bVar198) * bVar198 | (bVar275 >= bVar198) * bVar275;
  bVar246 = (bVar276 < bVar199) * bVar199 | (bVar276 >= bVar199) * bVar276;
  bVar247 = (bVar277 < bVar203) * bVar203 | (bVar277 >= bVar203) * bVar277;
  bVar248 = (bVar278 < bVar204) * bVar204 | (bVar278 >= bVar204) * bVar278;
  bVar249 = (bVar279 < bVar210) * bVar210 | (bVar279 >= bVar210) * bVar279;
  bVar250 = (bVar280 < bVar211) * bVar211 | (bVar280 >= bVar211) * bVar280;
  bVar251 = (bVar281 < bVar213) * bVar213 | (bVar281 >= bVar213) * bVar281;
  auVar171 = psubusb(auVar176,auVar293);
  auVar224 = psubusb(auVar293,auVar176);
  auVar224 = auVar224 | auVar171;
  auVar171 = psubusb(auVar175,auVar176);
  auVar236 = psubusb(auVar176,auVar175);
  auVar236 = auVar236 | auVar171;
  bVar283 = auVar224[0];
  bVar263 = auVar236[0];
  bVar263 = (bVar263 < bVar283) * bVar283 | (bVar263 >= bVar283) * bVar263;
  bVar283 = auVar224[1];
  bVar269 = auVar236[1];
  bVar269 = (bVar269 < bVar283) * bVar283 | (bVar269 >= bVar283) * bVar269;
  bVar283 = auVar224[2];
  bVar270 = auVar236[2];
  bVar270 = (bVar270 < bVar283) * bVar283 | (bVar270 >= bVar283) * bVar270;
  bVar283 = auVar224[3];
  bVar271 = auVar236[3];
  bVar271 = (bVar271 < bVar283) * bVar283 | (bVar271 >= bVar283) * bVar271;
  bVar283 = auVar224[4];
  bVar272 = auVar236[4];
  bVar272 = (bVar272 < bVar283) * bVar283 | (bVar272 >= bVar283) * bVar272;
  bVar283 = auVar224[5];
  bVar273 = auVar236[5];
  bVar273 = (bVar273 < bVar283) * bVar283 | (bVar273 >= bVar283) * bVar273;
  bVar283 = auVar224[6];
  bVar274 = auVar236[6];
  bVar274 = (bVar274 < bVar283) * bVar283 | (bVar274 >= bVar283) * bVar274;
  bVar283 = auVar224[7];
  bVar275 = auVar236[7];
  bVar275 = (bVar275 < bVar283) * bVar283 | (bVar275 >= bVar283) * bVar275;
  bVar283 = auVar224[8];
  bVar276 = auVar236[8];
  bVar276 = (bVar276 < bVar283) * bVar283 | (bVar276 >= bVar283) * bVar276;
  bVar283 = auVar224[9];
  bVar277 = auVar236[9];
  bVar277 = (bVar277 < bVar283) * bVar283 | (bVar277 >= bVar283) * bVar277;
  bVar283 = auVar224[10];
  bVar278 = auVar236[10];
  bVar278 = (bVar278 < bVar283) * bVar283 | (bVar278 >= bVar283) * bVar278;
  bVar283 = auVar224[0xb];
  bVar279 = auVar236[0xb];
  bVar279 = (bVar279 < bVar283) * bVar283 | (bVar279 >= bVar283) * bVar279;
  bVar283 = auVar224[0xc];
  bVar280 = auVar236[0xc];
  bVar280 = (bVar280 < bVar283) * bVar283 | (bVar280 >= bVar283) * bVar280;
  bVar283 = auVar224[0xd];
  bVar281 = auVar236[0xd];
  bVar281 = (bVar281 < bVar283) * bVar283 | (bVar281 >= bVar283) * bVar281;
  bVar283 = auVar224[0xe];
  bVar282 = auVar236[0xe];
  bVar284 = auVar236[0xf];
  bVar282 = (bVar282 < bVar283) * bVar283 | (bVar282 >= bVar283) * bVar282;
  bVar283 = auVar224[0xf];
  bVar283 = (bVar284 < bVar283) * bVar283 | (bVar284 >= bVar283) * bVar284;
  bVar263 = (bVar263 < bVar234) * bVar234 | (bVar263 >= bVar234) * bVar263;
  bVar269 = (bVar269 < bVar237) * bVar237 | (bVar269 >= bVar237) * bVar269;
  bVar270 = (bVar270 < bVar238) * bVar238 | (bVar270 >= bVar238) * bVar270;
  bVar271 = (bVar271 < bVar239) * bVar239 | (bVar271 >= bVar239) * bVar271;
  bVar272 = (bVar272 < bVar240) * bVar240 | (bVar272 >= bVar240) * bVar272;
  bVar273 = (bVar273 < bVar241) * bVar241 | (bVar273 >= bVar241) * bVar273;
  bVar274 = (bVar274 < bVar242) * bVar242 | (bVar274 >= bVar242) * bVar274;
  bVar275 = (bVar275 < bVar243) * bVar243 | (bVar275 >= bVar243) * bVar275;
  bVar276 = (bVar276 < bVar244) * bVar244 | (bVar276 >= bVar244) * bVar276;
  bVar277 = (bVar277 < bVar245) * bVar245 | (bVar277 >= bVar245) * bVar277;
  bVar278 = (bVar278 < bVar246) * bVar246 | (bVar278 >= bVar246) * bVar278;
  bVar279 = (bVar279 < bVar247) * bVar247 | (bVar279 >= bVar247) * bVar279;
  bVar280 = (bVar280 < bVar248) * bVar248 | (bVar280 >= bVar248) * bVar280;
  bVar281 = (bVar281 < bVar249) * bVar249 | (bVar281 >= bVar249) * bVar281;
  bVar282 = (bVar282 < bVar250) * bVar250 | (bVar282 >= bVar250) * bVar282;
  bVar284 = (bVar283 < bVar251) * bVar251 | (bVar283 >= bVar251) * bVar283;
  auVar171 = psubusb(auVar174,auVar173);
  auVar224 = psubusb(auVar173,auVar174);
  auVar224 = auVar224 | auVar171;
  auVar171 = psubusb(auVar179,auVar174);
  auVar236 = psubusb(auVar174,auVar179);
  auVar236 = auVar236 | auVar171;
  bVar283 = auVar224[0];
  bVar234 = auVar236[0];
  bVar234 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
  bVar283 = auVar224[1];
  bVar237 = auVar236[1];
  bVar237 = (bVar237 < bVar283) * bVar283 | (bVar237 >= bVar283) * bVar237;
  bVar283 = auVar224[2];
  bVar238 = auVar236[2];
  bVar238 = (bVar238 < bVar283) * bVar283 | (bVar238 >= bVar283) * bVar238;
  bVar283 = auVar224[3];
  bVar239 = auVar236[3];
  bVar239 = (bVar239 < bVar283) * bVar283 | (bVar239 >= bVar283) * bVar239;
  bVar283 = auVar224[4];
  bVar240 = auVar236[4];
  bVar240 = (bVar240 < bVar283) * bVar283 | (bVar240 >= bVar283) * bVar240;
  bVar283 = auVar224[5];
  bVar241 = auVar236[5];
  bVar241 = (bVar241 < bVar283) * bVar283 | (bVar241 >= bVar283) * bVar241;
  bVar283 = auVar224[6];
  bVar242 = auVar236[6];
  bVar242 = (bVar242 < bVar283) * bVar283 | (bVar242 >= bVar283) * bVar242;
  bVar283 = auVar224[7];
  bVar243 = auVar236[7];
  bVar243 = (bVar243 < bVar283) * bVar283 | (bVar243 >= bVar283) * bVar243;
  bVar283 = auVar224[8];
  bVar244 = auVar236[8];
  bVar244 = (bVar244 < bVar283) * bVar283 | (bVar244 >= bVar283) * bVar244;
  bVar283 = auVar224[9];
  bVar245 = auVar236[9];
  bVar245 = (bVar245 < bVar283) * bVar283 | (bVar245 >= bVar283) * bVar245;
  bVar283 = auVar224[10];
  bVar246 = auVar236[10];
  bVar246 = (bVar246 < bVar283) * bVar283 | (bVar246 >= bVar283) * bVar246;
  bVar283 = auVar224[0xb];
  bVar247 = auVar236[0xb];
  bVar247 = (bVar247 < bVar283) * bVar283 | (bVar247 >= bVar283) * bVar247;
  bVar283 = auVar224[0xc];
  bVar248 = auVar236[0xc];
  bVar248 = (bVar248 < bVar283) * bVar283 | (bVar248 >= bVar283) * bVar248;
  bVar283 = auVar224[0xd];
  bVar249 = auVar236[0xd];
  bVar249 = (bVar249 < bVar283) * bVar283 | (bVar249 >= bVar283) * bVar249;
  bVar283 = auVar224[0xe];
  bVar250 = auVar236[0xe];
  bVar251 = auVar236[0xf];
  bVar250 = (bVar250 < bVar283) * bVar283 | (bVar250 >= bVar283) * bVar250;
  bVar283 = auVar224[0xf];
  bVar283 = (bVar251 < bVar283) * bVar283 | (bVar251 >= bVar283) * bVar251;
  bVar251 = (bVar234 < bVar263) * bVar263 | (bVar234 >= bVar263) * bVar234;
  bVar263 = (bVar237 < bVar269) * bVar269 | (bVar237 >= bVar269) * bVar237;
  bVar269 = (bVar238 < bVar270) * bVar270 | (bVar238 >= bVar270) * bVar238;
  bVar270 = (bVar239 < bVar271) * bVar271 | (bVar239 >= bVar271) * bVar239;
  bVar271 = (bVar240 < bVar272) * bVar272 | (bVar240 >= bVar272) * bVar240;
  bVar272 = (bVar241 < bVar273) * bVar273 | (bVar241 >= bVar273) * bVar241;
  bVar273 = (bVar242 < bVar274) * bVar274 | (bVar242 >= bVar274) * bVar242;
  bVar274 = (bVar243 < bVar275) * bVar275 | (bVar243 >= bVar275) * bVar243;
  bVar275 = (bVar244 < bVar276) * bVar276 | (bVar244 >= bVar276) * bVar244;
  bVar276 = (bVar245 < bVar277) * bVar277 | (bVar245 >= bVar277) * bVar245;
  bVar277 = (bVar246 < bVar278) * bVar278 | (bVar246 >= bVar278) * bVar246;
  bVar278 = (bVar247 < bVar279) * bVar279 | (bVar247 >= bVar279) * bVar247;
  bVar279 = (bVar248 < bVar280) * bVar280 | (bVar248 >= bVar280) * bVar248;
  bVar280 = (bVar249 < bVar281) * bVar281 | (bVar249 >= bVar281) * bVar249;
  bVar281 = (bVar250 < bVar282) * bVar282 | (bVar250 >= bVar282) * bVar250;
  bVar282 = (bVar283 < bVar284) * bVar284 | (bVar283 >= bVar284) * bVar283;
  bVar283 = *_limit0;
  bVar234 = _limit0[1];
  bVar237 = _limit0[2];
  bVar238 = _limit0[3];
  bVar239 = _limit0[4];
  bVar240 = _limit0[5];
  bVar241 = _limit0[6];
  bVar242 = _limit0[7];
  bVar243 = _limit0[8];
  bVar244 = _limit0[9];
  bVar245 = _limit0[10];
  bVar246 = _limit0[0xb];
  bVar247 = _limit0[0xc];
  bVar248 = _limit0[0xd];
  bVar249 = _limit0[0xe];
  bVar250 = _limit0[0xf];
  auVar171[0] = -((byte)((bVar251 < bVar283) * bVar251 | (bVar251 >= bVar283) * bVar283) == bVar251)
  ;
  auVar171[1] = -((byte)((bVar263 < bVar234) * bVar263 | (bVar263 >= bVar234) * bVar234) == bVar263)
  ;
  auVar171[2] = -((byte)((bVar269 < bVar237) * bVar269 | (bVar269 >= bVar237) * bVar237) == bVar269)
  ;
  auVar171[3] = -((byte)((bVar270 < bVar238) * bVar270 | (bVar270 >= bVar238) * bVar238) == bVar270)
  ;
  auVar171[4] = -((byte)((bVar271 < bVar239) * bVar271 | (bVar271 >= bVar239) * bVar239) == bVar271)
  ;
  auVar171[5] = -((byte)((bVar272 < bVar240) * bVar272 | (bVar272 >= bVar240) * bVar240) == bVar272)
  ;
  auVar171[6] = -((byte)((bVar273 < bVar241) * bVar273 | (bVar273 >= bVar241) * bVar241) == bVar273)
  ;
  auVar171[7] = -((byte)((bVar274 < bVar242) * bVar274 | (bVar274 >= bVar242) * bVar242) == bVar274)
  ;
  auVar171[8] = -((byte)((bVar275 < bVar243) * bVar275 | (bVar275 >= bVar243) * bVar243) == bVar275)
  ;
  auVar171[9] = -((byte)((bVar276 < bVar244) * bVar276 | (bVar276 >= bVar244) * bVar244) == bVar276)
  ;
  auVar171[10] = -((byte)((bVar277 < bVar245) * bVar277 | (bVar277 >= bVar245) * bVar245) == bVar277
                  );
  auVar171[0xb] =
       -((byte)((bVar278 < bVar246) * bVar278 | (bVar278 >= bVar246) * bVar246) == bVar278);
  auVar171[0xc] =
       -((byte)((bVar279 < bVar247) * bVar279 | (bVar279 >= bVar247) * bVar247) == bVar279);
  auVar171[0xd] =
       -((byte)((bVar280 < bVar248) * bVar280 | (bVar280 >= bVar248) * bVar248) == bVar280);
  auVar171[0xe] =
       -((byte)((bVar281 < bVar249) * bVar281 | (bVar281 >= bVar249) * bVar249) == bVar281);
  bVar1 = (byte)((bVar282 < bVar250) * bVar282 | (bVar282 >= bVar250) * bVar250) == bVar282;
  auVar171[0xf] = -bVar1;
  if ((((((((((((((((auVar171 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar171 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar171 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar171 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar171 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar171 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar171 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar171 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar171 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar171 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar171 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar171 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar171 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar171 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar171 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar1) {
    auVar224 = psubusb(auVar176,auVar177);
    auVar236 = psubusb(auVar177,auVar176);
    auVar236 = auVar236 | auVar224;
    auVar224 = psubusb(auVar174,auVar172);
    auVar254 = psubusb(auVar172,auVar174);
    auVar254 = auVar254 | auVar224;
    bVar283 = auVar236[0];
    bVar234 = auVar254[0];
    bVar234 = (bVar234 < bVar283) * bVar283 | (bVar234 >= bVar283) * bVar234;
    bVar283 = auVar236[1];
    bVar237 = auVar254[1];
    bVar237 = (bVar237 < bVar283) * bVar283 | (bVar237 >= bVar283) * bVar237;
    bVar283 = auVar236[2];
    bVar238 = auVar254[2];
    bVar238 = (bVar238 < bVar283) * bVar283 | (bVar238 >= bVar283) * bVar238;
    bVar283 = auVar236[3];
    bVar239 = auVar254[3];
    bVar239 = (bVar239 < bVar283) * bVar283 | (bVar239 >= bVar283) * bVar239;
    bVar283 = auVar236[4];
    bVar240 = auVar254[4];
    bVar240 = (bVar240 < bVar283) * bVar283 | (bVar240 >= bVar283) * bVar240;
    bVar283 = auVar236[5];
    bVar241 = auVar254[5];
    bVar241 = (bVar241 < bVar283) * bVar283 | (bVar241 >= bVar283) * bVar241;
    bVar283 = auVar236[6];
    bVar242 = auVar254[6];
    bVar242 = (bVar242 < bVar283) * bVar283 | (bVar242 >= bVar283) * bVar242;
    bVar283 = auVar236[7];
    bVar243 = auVar254[7];
    bVar243 = (bVar243 < bVar283) * bVar283 | (bVar243 >= bVar283) * bVar243;
    bVar283 = auVar236[8];
    bVar244 = auVar254[8];
    bVar244 = (bVar244 < bVar283) * bVar283 | (bVar244 >= bVar283) * bVar244;
    bVar283 = auVar236[9];
    bVar245 = auVar254[9];
    bVar245 = (bVar245 < bVar283) * bVar283 | (bVar245 >= bVar283) * bVar245;
    bVar283 = auVar236[10];
    bVar246 = auVar254[10];
    bVar246 = (bVar246 < bVar283) * bVar283 | (bVar246 >= bVar283) * bVar246;
    bVar283 = auVar236[0xb];
    bVar247 = auVar254[0xb];
    bVar247 = (bVar247 < bVar283) * bVar283 | (bVar247 >= bVar283) * bVar247;
    bVar283 = auVar236[0xc];
    bVar248 = auVar254[0xc];
    bVar248 = (bVar248 < bVar283) * bVar283 | (bVar248 >= bVar283) * bVar248;
    bVar283 = auVar236[0xd];
    bVar249 = auVar254[0xd];
    bVar249 = (bVar249 < bVar283) * bVar283 | (bVar249 >= bVar283) * bVar249;
    bVar283 = auVar236[0xe];
    bVar250 = auVar254[0xe];
    bVar251 = auVar254[0xf];
    bVar250 = (bVar250 < bVar283) * bVar283 | (bVar250 >= bVar283) * bVar250;
    bVar283 = auVar236[0xf];
    bVar283 = (bVar251 < bVar283) * bVar283 | (bVar251 >= bVar283) * bVar251;
    bVar234 = (bVar234 < bVar167) * bVar167 | (bVar234 >= bVar167) * bVar234;
    bVar237 = (bVar237 < bVar180) * bVar180 | (bVar237 >= bVar180) * bVar237;
    bVar238 = (bVar238 < bVar181) * bVar181 | (bVar238 >= bVar181) * bVar238;
    bVar239 = (bVar239 < bVar185) * bVar185 | (bVar239 >= bVar185) * bVar239;
    bVar240 = (bVar240 < bVar186) * bVar186 | (bVar240 >= bVar186) * bVar240;
    bVar241 = (bVar241 < bVar189) * bVar189 | (bVar241 >= bVar189) * bVar241;
    bVar242 = (bVar242 < bVar190) * bVar190 | (bVar242 >= bVar190) * bVar242;
    bVar243 = (bVar243 < bVar193) * bVar193 | (bVar243 >= bVar193) * bVar243;
    bVar244 = (bVar244 < bVar194) * bVar194 | (bVar244 >= bVar194) * bVar244;
    bVar245 = (bVar245 < bVar198) * bVar198 | (bVar245 >= bVar198) * bVar245;
    bVar246 = (bVar246 < bVar199) * bVar199 | (bVar246 >= bVar199) * bVar246;
    bVar247 = (bVar247 < bVar203) * bVar203 | (bVar247 >= bVar203) * bVar247;
    bVar248 = (bVar248 < bVar204) * bVar204 | (bVar248 >= bVar204) * bVar248;
    bVar249 = (bVar249 < bVar210) * bVar210 | (bVar249 >= bVar210) * bVar249;
    bVar250 = (bVar250 < bVar211) * bVar211 | (bVar250 >= bVar211) * bVar250;
    bVar251 = (bVar283 < bVar213) * bVar213 | (bVar283 >= bVar213) * bVar283;
    auVar224 = psubusb(auVar175,auVar177);
    auVar236 = psubusb(auVar177,auVar175);
    auVar236 = auVar236 | auVar224;
    auVar224 = psubusb(auVar179,auVar172);
    auVar254 = psubusb(auVar172,auVar179);
    auVar254 = auVar254 | auVar224;
    bVar283 = auVar236[0];
    bVar263 = auVar254[0];
    bVar263 = (bVar263 < bVar283) * bVar283 | (bVar263 >= bVar283) * bVar263;
    bVar283 = auVar236[1];
    bVar269 = auVar254[1];
    bVar269 = (bVar269 < bVar283) * bVar283 | (bVar269 >= bVar283) * bVar269;
    bVar283 = auVar236[2];
    bVar270 = auVar254[2];
    bVar270 = (bVar270 < bVar283) * bVar283 | (bVar270 >= bVar283) * bVar270;
    bVar283 = auVar236[3];
    bVar271 = auVar254[3];
    bVar271 = (bVar271 < bVar283) * bVar283 | (bVar271 >= bVar283) * bVar271;
    bVar283 = auVar236[4];
    bVar272 = auVar254[4];
    bVar272 = (bVar272 < bVar283) * bVar283 | (bVar272 >= bVar283) * bVar272;
    bVar283 = auVar236[5];
    bVar273 = auVar254[5];
    bVar273 = (bVar273 < bVar283) * bVar283 | (bVar273 >= bVar283) * bVar273;
    bVar283 = auVar236[6];
    bVar274 = auVar254[6];
    bVar274 = (bVar274 < bVar283) * bVar283 | (bVar274 >= bVar283) * bVar274;
    bVar283 = auVar236[7];
    bVar275 = auVar254[7];
    bVar275 = (bVar275 < bVar283) * bVar283 | (bVar275 >= bVar283) * bVar275;
    bVar283 = auVar236[8];
    bVar276 = auVar254[8];
    bVar276 = (bVar276 < bVar283) * bVar283 | (bVar276 >= bVar283) * bVar276;
    bVar283 = auVar236[9];
    bVar277 = auVar254[9];
    bVar277 = (bVar277 < bVar283) * bVar283 | (bVar277 >= bVar283) * bVar277;
    bVar283 = auVar236[10];
    bVar278 = auVar254[10];
    bVar278 = (bVar278 < bVar283) * bVar283 | (bVar278 >= bVar283) * bVar278;
    bVar283 = auVar236[0xb];
    bVar279 = auVar254[0xb];
    bVar279 = (bVar279 < bVar283) * bVar283 | (bVar279 >= bVar283) * bVar279;
    bVar283 = auVar236[0xc];
    bVar280 = auVar254[0xc];
    bVar280 = (bVar280 < bVar283) * bVar283 | (bVar280 >= bVar283) * bVar280;
    bVar283 = auVar236[0xd];
    bVar281 = auVar254[0xd];
    bVar281 = (bVar281 < bVar283) * bVar283 | (bVar281 >= bVar283) * bVar281;
    bVar283 = auVar236[0xe];
    bVar282 = auVar254[0xe];
    bVar284 = auVar254[0xf];
    bVar282 = (bVar282 < bVar283) * bVar283 | (bVar282 >= bVar283) * bVar282;
    bVar283 = auVar236[0xf];
    bVar283 = (bVar284 < bVar283) * bVar283 | (bVar284 >= bVar283) * bVar284;
    bVar263 = (bVar263 < bVar234) * bVar234 | (bVar263 >= bVar234) * bVar263;
    bVar269 = (bVar269 < bVar237) * bVar237 | (bVar269 >= bVar237) * bVar269;
    bVar270 = (bVar270 < bVar238) * bVar238 | (bVar270 >= bVar238) * bVar270;
    bVar271 = (bVar271 < bVar239) * bVar239 | (bVar271 >= bVar239) * bVar271;
    bVar272 = (bVar272 < bVar240) * bVar240 | (bVar272 >= bVar240) * bVar272;
    bVar273 = (bVar273 < bVar241) * bVar241 | (bVar273 >= bVar241) * bVar273;
    bVar274 = (bVar274 < bVar242) * bVar242 | (bVar274 >= bVar242) * bVar274;
    bVar275 = (bVar275 < bVar243) * bVar243 | (bVar275 >= bVar243) * bVar275;
    bVar276 = (bVar276 < bVar244) * bVar244 | (bVar276 >= bVar244) * bVar276;
    bVar277 = (bVar277 < bVar245) * bVar245 | (bVar277 >= bVar245) * bVar277;
    bVar278 = (bVar278 < bVar246) * bVar246 | (bVar278 >= bVar246) * bVar278;
    bVar279 = (bVar279 < bVar247) * bVar247 | (bVar279 >= bVar247) * bVar279;
    bVar280 = (bVar280 < bVar248) * bVar248 | (bVar280 >= bVar248) * bVar280;
    bVar281 = (bVar281 < bVar249) * bVar249 | (bVar281 >= bVar249) * bVar281;
    bVar282 = (bVar282 < bVar250) * bVar250 | (bVar282 >= bVar250) * bVar282;
    bVar251 = (bVar283 < bVar251) * bVar251 | (bVar283 >= bVar251) * bVar283;
    bVar283 = DAT_0042b840;
    bVar234 = DAT_0042b840._1_1_;
    bVar237 = DAT_0042b840._2_1_;
    bVar238 = DAT_0042b840._3_1_;
    bVar239 = DAT_0042b840._4_1_;
    bVar240 = DAT_0042b840._5_1_;
    bVar241 = DAT_0042b840._6_1_;
    bVar242 = DAT_0042b840._7_1_;
    bVar243 = DAT_0042b840._8_1_;
    bVar244 = DAT_0042b840._9_1_;
    bVar245 = DAT_0042b840._10_1_;
    bVar246 = DAT_0042b840._11_1_;
    bVar247 = DAT_0042b840._12_1_;
    bVar248 = DAT_0042b840._13_1_;
    bVar249 = DAT_0042b840._14_1_;
    bVar250 = DAT_0042b840._15_1_;
    auVar359[0] = -((byte)((bVar283 < bVar263) * bVar283 | (bVar283 >= bVar263) * bVar263) ==
                   bVar263);
    auVar359[1] = -((byte)((bVar234 < bVar269) * bVar234 | (bVar234 >= bVar269) * bVar269) ==
                   bVar269);
    auVar359[2] = -((byte)((bVar237 < bVar270) * bVar237 | (bVar237 >= bVar270) * bVar270) ==
                   bVar270);
    auVar359[3] = -((byte)((bVar238 < bVar271) * bVar238 | (bVar238 >= bVar271) * bVar271) ==
                   bVar271);
    auVar359[4] = -((byte)((bVar239 < bVar272) * bVar239 | (bVar239 >= bVar272) * bVar272) ==
                   bVar272);
    auVar359[5] = -((byte)((bVar240 < bVar273) * bVar240 | (bVar240 >= bVar273) * bVar273) ==
                   bVar273);
    auVar359[6] = -((byte)((bVar241 < bVar274) * bVar241 | (bVar241 >= bVar274) * bVar274) ==
                   bVar274);
    auVar359[7] = -((byte)((bVar242 < bVar275) * bVar242 | (bVar242 >= bVar275) * bVar275) ==
                   bVar275);
    auVar359[8] = -((byte)((bVar243 < bVar276) * bVar243 | (bVar243 >= bVar276) * bVar276) ==
                   bVar276);
    auVar359[9] = -((byte)((bVar244 < bVar277) * bVar244 | (bVar244 >= bVar277) * bVar277) ==
                   bVar277);
    auVar359[10] = -((byte)((bVar245 < bVar278) * bVar245 | (bVar245 >= bVar278) * bVar278) ==
                    bVar278);
    auVar359[0xb] =
         -((byte)((bVar246 < bVar279) * bVar246 | (bVar246 >= bVar279) * bVar279) == bVar279);
    auVar359[0xc] =
         -((byte)((bVar247 < bVar280) * bVar247 | (bVar247 >= bVar280) * bVar280) == bVar280);
    auVar359[0xd] =
         -((byte)((bVar248 < bVar281) * bVar248 | (bVar248 >= bVar281) * bVar281) == bVar281);
    auVar359[0xe] =
         -((byte)((bVar249 < bVar282) * bVar249 | (bVar249 >= bVar282) * bVar282) == bVar282);
    auVar359[0xf] =
         -((byte)((bVar250 < bVar251) * bVar250 | (bVar250 >= bVar251) * bVar251) == bVar251);
    auVar359 = auVar359 & auVar171;
    bVar251 = *_thresh0;
    bVar263 = _thresh0[1];
    bVar269 = _thresh0[2];
    bVar270 = _thresh0[3];
    bVar271 = _thresh0[4];
    bVar272 = _thresh0[5];
    bVar273 = _thresh0[6];
    bVar274 = _thresh0[7];
    bVar275 = _thresh0[8];
    bVar276 = _thresh0[9];
    bVar277 = _thresh0[10];
    bVar278 = _thresh0[0xb];
    bVar279 = _thresh0[0xc];
    bVar280 = _thresh0[0xd];
    bVar281 = _thresh0[0xe];
    bVar282 = _thresh0[0xf];
    auVar266[0] = -((byte)((bVar167 < bVar251) * bVar167 | (bVar167 >= bVar251) * bVar251) ==
                   bVar167);
    auVar266[1] = -((byte)((bVar180 < bVar263) * bVar180 | (bVar180 >= bVar263) * bVar263) ==
                   bVar180);
    auVar266[2] = -((byte)((bVar181 < bVar269) * bVar181 | (bVar181 >= bVar269) * bVar269) ==
                   bVar181);
    auVar266[3] = -((byte)((bVar185 < bVar270) * bVar185 | (bVar185 >= bVar270) * bVar270) ==
                   bVar185);
    auVar266[4] = -((byte)((bVar186 < bVar271) * bVar186 | (bVar186 >= bVar271) * bVar271) ==
                   bVar186);
    auVar266[5] = -((byte)((bVar189 < bVar272) * bVar189 | (bVar189 >= bVar272) * bVar272) ==
                   bVar189);
    auVar266[6] = -((byte)((bVar190 < bVar273) * bVar190 | (bVar190 >= bVar273) * bVar273) ==
                   bVar190);
    auVar266[7] = -((byte)((bVar193 < bVar274) * bVar193 | (bVar193 >= bVar274) * bVar274) ==
                   bVar193);
    auVar266[8] = -((byte)((bVar194 < bVar275) * bVar194 | (bVar194 >= bVar275) * bVar275) ==
                   bVar194);
    auVar266[9] = -((byte)((bVar198 < bVar276) * bVar198 | (bVar198 >= bVar276) * bVar276) ==
                   bVar198);
    auVar266[10] = -((byte)((bVar199 < bVar277) * bVar199 | (bVar199 >= bVar277) * bVar277) ==
                    bVar199);
    auVar266[0xb] =
         -((byte)((bVar203 < bVar278) * bVar203 | (bVar203 >= bVar278) * bVar278) == bVar203);
    auVar266[0xc] =
         -((byte)((bVar204 < bVar279) * bVar204 | (bVar204 >= bVar279) * bVar279) == bVar204);
    auVar266[0xd] =
         -((byte)((bVar210 < bVar280) * bVar210 | (bVar210 >= bVar280) * bVar280) == bVar210);
    auVar266[0xe] =
         -((byte)((bVar211 < bVar281) * bVar211 | (bVar211 >= bVar281) * bVar281) == bVar211);
    auVar266[0xf] =
         -((byte)((bVar213 < bVar282) * bVar213 | (bVar213 >= bVar282) * bVar282) == bVar213);
    auVar236 = psubsb(auVar293 ^ _DAT_0042cb20,auVar173 ^ _DAT_0042cb20);
    auVar224 = psubsb(auVar172 ^ _DAT_0042cb20,auVar177 ^ _DAT_0042cb20);
    auVar236 = paddsb(~auVar266 & auVar236,auVar224);
    auVar236 = paddsb(auVar236,auVar224);
    auVar254 = paddsb(auVar236,auVar224);
    auVar224 = paddsb(_DAT_0046ef90,auVar254 & auVar171);
    auVar236[0] = -(auVar224[0] < '\0');
    auVar236[1] = -(auVar224[1] < '\0');
    auVar236[2] = -(auVar224[2] < '\0');
    auVar236[3] = -(auVar224[3] < '\0');
    auVar236[4] = -(auVar224[4] < '\0');
    auVar236[5] = -(auVar224[5] < '\0');
    auVar236[6] = -(auVar224[6] < '\0');
    auVar236[7] = -(auVar224[7] < '\0');
    auVar236[8] = -(auVar224[8] < '\0');
    auVar236[9] = -(auVar224[9] < '\0');
    auVar236[10] = -(auVar224[10] < '\0');
    auVar236[0xb] = -(auVar224[0xb] < '\0');
    auVar236[0xc] = -(auVar224[0xc] < '\0');
    auVar236[0xd] = -(auVar224[0xd] < '\0');
    auVar236[0xe] = -(auVar224[0xe] < '\0');
    auVar236[0xf] = -(auVar224[0xf] < '\0');
    auVar339 = paddsb(auVar254 & auVar171,_DAT_0046ef80);
    auVar265._0_2_ = auVar224._0_2_ >> 3;
    auVar265._2_2_ = auVar224._2_2_ >> 3;
    auVar265._4_2_ = auVar224._4_2_ >> 3;
    auVar265._6_2_ = auVar224._6_2_ >> 3;
    auVar265._8_2_ = auVar224._8_2_ >> 3;
    auVar265._10_2_ = auVar224._10_2_ >> 3;
    auVar265._12_2_ = auVar224._12_2_ >> 3;
    auVar265._14_2_ = auVar224._14_2_ >> 3;
    auVar171 = ~_DAT_0042b870 & auVar236 | auVar265 & _DAT_0042b870;
    auVar254[0] = -(auVar339[0] < '\0');
    auVar254[1] = -(auVar339[1] < '\0');
    auVar254[2] = -(auVar339[2] < '\0');
    auVar254[3] = -(auVar339[3] < '\0');
    auVar254[4] = -(auVar339[4] < '\0');
    auVar254[5] = -(auVar339[5] < '\0');
    auVar254[6] = -(auVar339[6] < '\0');
    auVar254[7] = -(auVar339[7] < '\0');
    auVar254[8] = -(auVar339[8] < '\0');
    auVar254[9] = -(auVar339[9] < '\0');
    auVar254[10] = -(auVar339[10] < '\0');
    auVar254[0xb] = -(auVar339[0xb] < '\0');
    auVar254[0xc] = -(auVar339[0xc] < '\0');
    auVar254[0xd] = -(auVar339[0xd] < '\0');
    auVar254[0xe] = -(auVar339[0xe] < '\0');
    auVar254[0xf] = -(auVar339[0xf] < '\0');
    auVar340._0_2_ = auVar339._0_2_ >> 3;
    auVar340._2_2_ = auVar339._2_2_ >> 3;
    auVar340._4_2_ = auVar339._4_2_ >> 3;
    auVar340._6_2_ = auVar339._6_2_ >> 3;
    auVar340._8_2_ = auVar339._8_2_ >> 3;
    auVar340._10_2_ = auVar339._10_2_ >> 3;
    auVar340._12_2_ = auVar339._12_2_ >> 3;
    auVar340._14_2_ = auVar339._14_2_ >> 3;
    auVar236 = psubsb(auVar172 ^ _DAT_0042cb20,auVar171);
    auVar254 = paddsb(~_DAT_0042b870 & auVar254 | auVar340 & _DAT_0042b870,auVar177 ^ _DAT_0042cb20)
    ;
    auVar171 = paddsb(auVar171,_DAT_0042b840);
    auVar339._0_2_ = auVar171._0_2_ >> 1;
    auVar339._2_2_ = auVar171._2_2_ >> 1;
    auVar339._4_2_ = auVar171._4_2_ >> 1;
    auVar339._6_2_ = auVar171._6_2_ >> 1;
    auVar339._8_2_ = auVar171._8_2_ >> 1;
    auVar339._10_2_ = auVar171._10_2_ >> 1;
    auVar339._12_2_ = auVar171._12_2_ >> 1;
    auVar339._14_2_ = auVar171._14_2_ >> 1;
    auVar266 = (~_DAT_0042b850 & auVar171 | auVar339 & _DAT_0042b850) & auVar266;
    auVar171 = paddsb(auVar293 ^ _DAT_0042cb20,auVar266);
    auVar224 = psubsb(auVar173 ^ _DAT_0042cb20,auVar266);
    lVar165 = lVar166 * -2;
    lVar164 = -lVar166;
    auVar236 = auVar236 ^ _DAT_0042cb20;
    auVar254 = auVar254 ^ _DAT_0042cb20;
    auVar224 = auVar224 ^ _DAT_0042cb20;
    if ((((((((((((((((auVar359 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar359 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar359 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar359 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar359 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar359 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar359 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar359 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar359 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar359 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar359 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar359 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar359 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar359 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar359 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar359[0xf])
    {
      *(undefined1 (*) [16])(s + lVar165) = auVar171 ^ _DAT_0042cb20;
      *(undefined1 (*) [16])(s + lVar164) = auVar254;
      *(undefined1 (*) [16])s = auVar236;
      *(undefined1 (*) [16])(s + lVar166) = auVar224;
    }
    else {
      auVar339 = *(undefined1 (*) [16])(s + lVar166 * -6);
      auVar265 = *(undefined1 (*) [16])(s + lVar166 * -5);
      auVar266 = *(undefined1 (*) [16])(s + lVar166 * 4);
      auVar340 = *(undefined1 (*) [16])(s + lVar166 * 5);
      auVar178 = *(undefined1 (*) [16])(s + lVar166 * 6);
      auVar255 = psubusb(auVar265,auVar177);
      auVar267 = psubusb(auVar177,auVar265);
      auVar267 = auVar267 | auVar255;
      auVar255 = psubusb(auVar266,auVar172);
      auVar302 = psubusb(auVar172,auVar266);
      auVar302 = auVar302 | auVar255;
      bVar251 = auVar267[0];
      bVar263 = auVar302[0];
      bVar263 = (bVar263 < bVar251) * bVar251 | (bVar263 >= bVar251) * bVar263;
      bVar251 = auVar267[1];
      bVar269 = auVar302[1];
      bVar269 = (bVar269 < bVar251) * bVar251 | (bVar269 >= bVar251) * bVar269;
      bVar251 = auVar267[2];
      bVar270 = auVar302[2];
      bVar270 = (bVar270 < bVar251) * bVar251 | (bVar270 >= bVar251) * bVar270;
      bVar251 = auVar267[3];
      bVar271 = auVar302[3];
      bVar271 = (bVar271 < bVar251) * bVar251 | (bVar271 >= bVar251) * bVar271;
      bVar251 = auVar267[4];
      bVar272 = auVar302[4];
      bVar272 = (bVar272 < bVar251) * bVar251 | (bVar272 >= bVar251) * bVar272;
      bVar251 = auVar267[5];
      bVar273 = auVar302[5];
      bVar273 = (bVar273 < bVar251) * bVar251 | (bVar273 >= bVar251) * bVar273;
      bVar251 = auVar267[6];
      bVar274 = auVar302[6];
      bVar274 = (bVar274 < bVar251) * bVar251 | (bVar274 >= bVar251) * bVar274;
      bVar251 = auVar267[7];
      bVar275 = auVar302[7];
      bVar275 = (bVar275 < bVar251) * bVar251 | (bVar275 >= bVar251) * bVar275;
      bVar251 = auVar267[8];
      bVar276 = auVar302[8];
      bVar276 = (bVar276 < bVar251) * bVar251 | (bVar276 >= bVar251) * bVar276;
      bVar251 = auVar267[9];
      bVar277 = auVar302[9];
      bVar277 = (bVar277 < bVar251) * bVar251 | (bVar277 >= bVar251) * bVar277;
      bVar251 = auVar267[10];
      bVar278 = auVar302[10];
      bVar278 = (bVar278 < bVar251) * bVar251 | (bVar278 >= bVar251) * bVar278;
      bVar251 = auVar267[0xb];
      bVar279 = auVar302[0xb];
      bVar279 = (bVar279 < bVar251) * bVar251 | (bVar279 >= bVar251) * bVar279;
      bVar251 = auVar267[0xc];
      bVar280 = auVar302[0xc];
      bVar280 = (bVar280 < bVar251) * bVar251 | (bVar280 >= bVar251) * bVar280;
      bVar251 = auVar267[0xd];
      bVar281 = auVar302[0xd];
      bVar281 = (bVar281 < bVar251) * bVar251 | (bVar281 >= bVar251) * bVar281;
      bVar251 = auVar267[0xe];
      bVar282 = auVar302[0xe];
      bVar167 = auVar302[0xf];
      bVar282 = (bVar282 < bVar251) * bVar251 | (bVar282 >= bVar251) * bVar282;
      bVar251 = auVar267[0xf];
      bVar167 = (bVar167 < bVar251) * bVar251 | (bVar167 >= bVar251) * bVar167;
      auVar255 = psubusb(auVar339,auVar177);
      auVar267 = psubusb(auVar177,auVar339);
      auVar267 = auVar267 | auVar255;
      auVar255 = psubusb(auVar340,auVar172);
      auVar302 = psubusb(auVar172,auVar340);
      auVar302 = auVar302 | auVar255;
      auVar255 = *(undefined1 (*) [16])(s + -(long)(p * 7));
      bVar251 = auVar267[0];
      bVar180 = auVar302[0];
      bVar180 = (bVar180 < bVar251) * bVar251 | (bVar180 >= bVar251) * bVar180;
      bVar251 = auVar267[1];
      bVar181 = auVar302[1];
      bVar181 = (bVar181 < bVar251) * bVar251 | (bVar181 >= bVar251) * bVar181;
      bVar251 = auVar267[2];
      bVar185 = auVar302[2];
      bVar185 = (bVar185 < bVar251) * bVar251 | (bVar185 >= bVar251) * bVar185;
      bVar251 = auVar267[3];
      bVar186 = auVar302[3];
      bVar186 = (bVar186 < bVar251) * bVar251 | (bVar186 >= bVar251) * bVar186;
      bVar251 = auVar267[4];
      bVar189 = auVar302[4];
      bVar193 = (bVar189 < bVar251) * bVar251 | (bVar189 >= bVar251) * bVar189;
      bVar251 = auVar267[5];
      bVar189 = auVar302[5];
      bVar194 = (bVar189 < bVar251) * bVar251 | (bVar189 >= bVar251) * bVar189;
      bVar251 = auVar267[6];
      bVar189 = auVar302[6];
      bVar198 = (bVar189 < bVar251) * bVar251 | (bVar189 >= bVar251) * bVar189;
      bVar251 = auVar267[7];
      bVar189 = auVar302[7];
      bVar199 = (bVar189 < bVar251) * bVar251 | (bVar189 >= bVar251) * bVar189;
      bVar251 = auVar267[8];
      bVar189 = auVar302[8];
      bVar203 = (bVar189 < bVar251) * bVar251 | (bVar189 >= bVar251) * bVar189;
      bVar251 = auVar267[9];
      bVar189 = auVar302[9];
      bVar204 = (bVar189 < bVar251) * bVar251 | (bVar189 >= bVar251) * bVar189;
      bVar251 = auVar267[10];
      bVar189 = auVar302[10];
      bVar210 = (bVar189 < bVar251) * bVar251 | (bVar189 >= bVar251) * bVar189;
      bVar251 = auVar267[0xb];
      bVar189 = auVar302[0xb];
      bVar211 = (bVar189 < bVar251) * bVar251 | (bVar189 >= bVar251) * bVar189;
      bVar251 = auVar267[0xc];
      bVar189 = auVar302[0xc];
      bVar213 = (bVar189 < bVar251) * bVar251 | (bVar189 >= bVar251) * bVar189;
      bVar251 = auVar267[0xd];
      bVar189 = auVar302[0xd];
      bVar284 = (bVar189 < bVar251) * bVar251 | (bVar189 >= bVar251) * bVar189;
      bVar251 = auVar267[0xe];
      bVar189 = auVar302[0xe];
      bVar190 = auVar302[0xf];
      bVar354 = (bVar189 < bVar251) * bVar251 | (bVar189 >= bVar251) * bVar189;
      bVar251 = auVar267[0xf];
      bVar251 = (bVar190 < bVar251) * bVar251 | (bVar190 >= bVar251) * bVar190;
      bVar180 = (bVar180 < bVar263) * bVar263 | (bVar180 >= bVar263) * bVar180;
      bVar181 = (bVar181 < bVar269) * bVar269 | (bVar181 >= bVar269) * bVar181;
      bVar189 = (bVar185 < bVar270) * bVar270 | (bVar185 >= bVar270) * bVar185;
      bVar190 = (bVar186 < bVar271) * bVar271 | (bVar186 >= bVar271) * bVar186;
      bVar193 = (bVar193 < bVar272) * bVar272 | (bVar193 >= bVar272) * bVar193;
      bVar194 = (bVar194 < bVar273) * bVar273 | (bVar194 >= bVar273) * bVar194;
      bVar198 = (bVar198 < bVar274) * bVar274 | (bVar198 >= bVar274) * bVar198;
      bVar199 = (bVar199 < bVar275) * bVar275 | (bVar199 >= bVar275) * bVar199;
      bVar203 = (bVar203 < bVar276) * bVar276 | (bVar203 >= bVar276) * bVar203;
      bVar204 = (bVar204 < bVar277) * bVar277 | (bVar204 >= bVar277) * bVar204;
      bVar210 = (bVar210 < bVar278) * bVar278 | (bVar210 >= bVar278) * bVar210;
      bVar211 = (bVar211 < bVar279) * bVar279 | (bVar211 >= bVar279) * bVar211;
      bVar213 = (bVar213 < bVar280) * bVar280 | (bVar213 >= bVar280) * bVar213;
      bVar284 = (bVar284 < bVar281) * bVar281 | (bVar284 >= bVar281) * bVar284;
      bVar354 = (bVar354 < bVar282) * bVar282 | (bVar354 >= bVar282) * bVar354;
      bVar357 = (bVar251 < bVar167) * bVar167 | (bVar251 >= bVar167) * bVar251;
      auVar267 = psubusb(auVar255,auVar177);
      auVar302 = psubusb(auVar177,auVar255);
      auVar302 = auVar302 | auVar267;
      auVar267 = psubusb(auVar178,auVar172);
      auVar303 = psubusb(auVar172,auVar178);
      auVar303 = auVar303 | auVar267;
      bVar251 = auVar302[0];
      bVar263 = auVar303[0];
      bVar263 = (bVar263 < bVar251) * bVar251 | (bVar263 >= bVar251) * bVar263;
      bVar251 = auVar302[1];
      bVar269 = auVar303[1];
      bVar269 = (bVar269 < bVar251) * bVar251 | (bVar269 >= bVar251) * bVar269;
      bVar251 = auVar302[2];
      bVar270 = auVar303[2];
      bVar270 = (bVar270 < bVar251) * bVar251 | (bVar270 >= bVar251) * bVar270;
      bVar251 = auVar302[3];
      bVar271 = auVar303[3];
      bVar271 = (bVar271 < bVar251) * bVar251 | (bVar271 >= bVar251) * bVar271;
      bVar251 = auVar302[4];
      bVar272 = auVar303[4];
      bVar272 = (bVar272 < bVar251) * bVar251 | (bVar272 >= bVar251) * bVar272;
      bVar251 = auVar302[5];
      bVar273 = auVar303[5];
      bVar273 = (bVar273 < bVar251) * bVar251 | (bVar273 >= bVar251) * bVar273;
      bVar251 = auVar302[6];
      bVar274 = auVar303[6];
      bVar274 = (bVar274 < bVar251) * bVar251 | (bVar274 >= bVar251) * bVar274;
      bVar251 = auVar302[7];
      bVar275 = auVar303[7];
      bVar275 = (bVar275 < bVar251) * bVar251 | (bVar275 >= bVar251) * bVar275;
      bVar251 = auVar302[8];
      bVar276 = auVar303[8];
      bVar276 = (bVar276 < bVar251) * bVar251 | (bVar276 >= bVar251) * bVar276;
      bVar251 = auVar302[9];
      bVar277 = auVar303[9];
      bVar277 = (bVar277 < bVar251) * bVar251 | (bVar277 >= bVar251) * bVar277;
      bVar251 = auVar302[10];
      bVar278 = auVar303[10];
      bVar278 = (bVar278 < bVar251) * bVar251 | (bVar278 >= bVar251) * bVar278;
      bVar251 = auVar302[0xb];
      bVar279 = auVar303[0xb];
      bVar279 = (bVar279 < bVar251) * bVar251 | (bVar279 >= bVar251) * bVar279;
      bVar251 = auVar302[0xc];
      bVar280 = auVar303[0xc];
      bVar280 = (bVar280 < bVar251) * bVar251 | (bVar280 >= bVar251) * bVar280;
      bVar251 = auVar302[0xd];
      bVar281 = auVar303[0xd];
      bVar281 = (bVar281 < bVar251) * bVar251 | (bVar281 >= bVar251) * bVar281;
      bVar251 = auVar302[0xe];
      bVar282 = auVar303[0xe];
      bVar167 = auVar303[0xf];
      bVar282 = (bVar282 < bVar251) * bVar251 | (bVar282 >= bVar251) * bVar282;
      bVar251 = auVar302[0xf];
      bVar251 = (bVar167 < bVar251) * bVar251 | (bVar167 >= bVar251) * bVar167;
      bVar185 = (bVar263 < bVar180) * bVar180 | (bVar263 >= bVar180) * bVar263;
      bVar186 = (bVar269 < bVar181) * bVar181 | (bVar269 >= bVar181) * bVar269;
      bVar189 = (bVar270 < bVar189) * bVar189 | (bVar270 >= bVar189) * bVar270;
      bVar190 = (bVar271 < bVar190) * bVar190 | (bVar271 >= bVar190) * bVar271;
      bVar193 = (bVar272 < bVar193) * bVar193 | (bVar272 >= bVar193) * bVar272;
      bVar194 = (bVar273 < bVar194) * bVar194 | (bVar273 >= bVar194) * bVar273;
      bVar198 = (bVar274 < bVar198) * bVar198 | (bVar274 >= bVar198) * bVar274;
      bVar199 = (bVar275 < bVar199) * bVar199 | (bVar275 >= bVar199) * bVar275;
      bVar203 = (bVar276 < bVar203) * bVar203 | (bVar276 >= bVar203) * bVar276;
      bVar204 = (bVar277 < bVar204) * bVar204 | (bVar277 >= bVar204) * bVar277;
      bVar210 = (bVar278 < bVar210) * bVar210 | (bVar278 >= bVar210) * bVar278;
      bVar211 = (bVar279 < bVar211) * bVar211 | (bVar279 >= bVar211) * bVar279;
      bVar213 = (bVar280 < bVar213) * bVar213 | (bVar280 >= bVar213) * bVar280;
      bVar284 = (bVar281 < bVar284) * bVar284 | (bVar281 >= bVar284) * bVar281;
      bVar354 = (bVar282 < bVar354) * bVar354 | (bVar282 >= bVar354) * bVar282;
      bVar357 = (bVar251 < bVar357) * bVar357 | (bVar251 >= bVar357) * bVar251;
      auVar2[0xd] = 0;
      auVar2._0_13_ = auVar175._0_13_;
      auVar2[0xe] = auVar175[7];
      uVar170 = auVar2._13_2_;
      auVar16[0xc] = auVar175[6];
      auVar16._0_12_ = auVar175._0_12_;
      auVar16._13_2_ = uVar170;
      auVar30[0xb] = 0;
      auVar30._0_11_ = auVar175._0_11_;
      auVar30._12_3_ = auVar16._12_3_;
      auVar44[10] = auVar175[5];
      auVar44._0_10_ = auVar175._0_10_;
      auVar44._11_4_ = auVar30._11_4_;
      auVar58[9] = 0;
      auVar58._0_9_ = auVar175._0_9_;
      auVar58._10_5_ = auVar44._10_5_;
      auVar72[8] = auVar175[4];
      auVar72._0_8_ = auVar175._0_8_;
      auVar72._9_6_ = auVar58._9_6_;
      auVar100._7_8_ = 0;
      auVar100._0_7_ = auVar72._8_7_;
      Var101 = CONCAT81(SUB158(auVar100 << 0x40,7),auVar175[3]);
      auVar136._9_6_ = 0;
      auVar136._0_9_ = Var101;
      auVar102._1_10_ = SUB1510(auVar136 << 0x30,5);
      auVar102[0] = auVar175[2];
      auVar137._11_4_ = 0;
      auVar137._0_11_ = auVar102;
      auVar86[2] = auVar175[1];
      auVar86._0_2_ = auVar175._0_2_;
      auVar86._3_12_ = SUB1512(auVar137 << 0x20,3);
      uVar221 = auVar175._0_2_ & 0xff;
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar176._0_13_;
      auVar3[0xe] = auVar176[7];
      uVar184 = auVar3._13_2_;
      auVar17[0xc] = auVar176[6];
      auVar17._0_12_ = auVar176._0_12_;
      auVar17._13_2_ = uVar184;
      auVar31[0xb] = 0;
      auVar31._0_11_ = auVar176._0_11_;
      auVar31._12_3_ = auVar17._12_3_;
      auVar45[10] = auVar176[5];
      auVar45._0_10_ = auVar176._0_10_;
      auVar45._11_4_ = auVar31._11_4_;
      auVar59[9] = 0;
      auVar59._0_9_ = auVar176._0_9_;
      auVar59._10_5_ = auVar45._10_5_;
      auVar73[8] = auVar176[4];
      auVar73._0_8_ = auVar176._0_8_;
      auVar73._9_6_ = auVar59._9_6_;
      auVar103._7_8_ = 0;
      auVar103._0_7_ = auVar73._8_7_;
      Var104 = CONCAT81(SUB158(auVar103 << 0x40,7),auVar176[3]);
      auVar138._9_6_ = 0;
      auVar138._0_9_ = Var104;
      auVar105._1_10_ = SUB1510(auVar138 << 0x30,5);
      auVar105[0] = auVar176[2];
      auVar139._11_4_ = 0;
      auVar139._0_11_ = auVar105;
      auVar87[2] = auVar176[1];
      auVar87._0_2_ = auVar176._0_2_;
      auVar87._3_12_ = SUB1512(auVar139 << 0x20,3);
      uVar360 = auVar176._0_2_ & 0xff;
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar293._0_13_;
      auVar4[0xe] = auVar293[7];
      uVar292 = auVar4._13_2_;
      auVar18[0xc] = auVar293[6];
      auVar18._0_12_ = auVar293._0_12_;
      auVar18._13_2_ = uVar292;
      auVar32[0xb] = 0;
      auVar32._0_11_ = auVar293._0_11_;
      auVar32._12_3_ = auVar18._12_3_;
      auVar46[10] = auVar293[5];
      auVar46._0_10_ = auVar293._0_10_;
      auVar46._11_4_ = auVar32._11_4_;
      auVar60[9] = 0;
      auVar60._0_9_ = auVar293._0_9_;
      auVar60._10_5_ = auVar46._10_5_;
      auVar74[8] = auVar293[4];
      auVar74._0_8_ = auVar293._0_8_;
      auVar74._9_6_ = auVar60._9_6_;
      auVar106._7_8_ = 0;
      auVar106._0_7_ = auVar74._8_7_;
      Var107 = CONCAT81(SUB158(auVar106 << 0x40,7),auVar293[3]);
      auVar140._9_6_ = 0;
      auVar140._0_9_ = Var107;
      auVar108._1_10_ = SUB1510(auVar140 << 0x30,5);
      auVar108[0] = auVar293[2];
      auVar141._11_4_ = 0;
      auVar141._0_11_ = auVar108;
      auVar88[2] = auVar293[1];
      auVar88._0_2_ = auVar293._0_2_;
      auVar88._3_12_ = SUB1512(auVar141 << 0x20,3);
      uVar235 = auVar293._0_2_ & 0xff;
      auVar5[0xd] = 0;
      auVar5._0_13_ = auVar177._0_13_;
      auVar5[0xe] = auVar177[7];
      uVar169 = auVar5._13_2_;
      auVar19[0xc] = auVar177[6];
      auVar19._0_12_ = auVar177._0_12_;
      auVar19._13_2_ = uVar169;
      auVar33[0xb] = 0;
      auVar33._0_11_ = auVar177._0_11_;
      auVar33._12_3_ = auVar19._12_3_;
      auVar47[10] = auVar177[5];
      auVar47._0_10_ = auVar177._0_10_;
      auVar47._11_4_ = auVar33._11_4_;
      auVar61[9] = 0;
      auVar61._0_9_ = auVar177._0_9_;
      auVar61._10_5_ = auVar47._10_5_;
      auVar75[8] = auVar177[4];
      auVar75._0_8_ = auVar177._0_8_;
      auVar75._9_6_ = auVar61._9_6_;
      auVar109._7_8_ = 0;
      auVar109._0_7_ = auVar75._8_7_;
      Var110 = CONCAT81(SUB158(auVar109 << 0x40,7),auVar177[3]);
      auVar142._9_6_ = 0;
      auVar142._0_9_ = Var110;
      auVar111._1_10_ = SUB1510(auVar142 << 0x30,5);
      auVar111[0] = auVar177[2];
      auVar143._11_4_ = 0;
      auVar143._0_11_ = auVar111;
      auVar89[2] = auVar177[1];
      auVar89._0_2_ = auVar177._0_2_;
      auVar89._3_12_ = SUB1512(auVar143 << 0x20,3);
      uVar207 = auVar177._0_2_ & 0xff;
      auVar6[0xd] = 0;
      auVar6._0_13_ = auVar172._0_13_;
      auVar6[0xe] = auVar172[7];
      uVar183 = auVar6._13_2_;
      auVar20[0xc] = auVar172[6];
      auVar20._0_12_ = auVar172._0_12_;
      auVar20._13_2_ = uVar183;
      auVar34[0xb] = 0;
      auVar34._0_11_ = auVar172._0_11_;
      auVar34._12_3_ = auVar20._12_3_;
      auVar48[10] = auVar172[5];
      auVar48._0_10_ = auVar172._0_10_;
      auVar48._11_4_ = auVar34._11_4_;
      auVar62[9] = 0;
      auVar62._0_9_ = auVar172._0_9_;
      auVar62._10_5_ = auVar48._10_5_;
      auVar76[8] = auVar172[4];
      auVar76._0_8_ = auVar172._0_8_;
      auVar76._9_6_ = auVar62._9_6_;
      auVar112._7_8_ = 0;
      auVar112._0_7_ = auVar76._8_7_;
      Var113 = CONCAT81(SUB158(auVar112 << 0x40,7),auVar172[3]);
      auVar144._9_6_ = 0;
      auVar144._0_9_ = Var113;
      auVar114._1_10_ = SUB1510(auVar144 << 0x30,5);
      auVar114[0] = auVar172[2];
      auVar145._11_4_ = 0;
      auVar145._0_11_ = auVar114;
      auVar90[2] = auVar172[1];
      auVar90._0_2_ = auVar172._0_2_;
      auVar90._3_12_ = SUB1512(auVar145 << 0x20,3);
      uVar208 = auVar172._0_2_ & 0xff;
      auVar7[0xd] = 0;
      auVar7._0_13_ = auVar173._0_13_;
      auVar7[0xe] = auVar173[7];
      auVar21[0xc] = auVar173[6];
      auVar21._0_12_ = auVar173._0_12_;
      auVar21._13_2_ = auVar7._13_2_;
      auVar35[0xb] = 0;
      auVar35._0_11_ = auVar173._0_11_;
      auVar35._12_3_ = auVar21._12_3_;
      auVar49[10] = auVar173[5];
      auVar49._0_10_ = auVar173._0_10_;
      auVar49._11_4_ = auVar35._11_4_;
      auVar63[9] = 0;
      auVar63._0_9_ = auVar173._0_9_;
      auVar63._10_5_ = auVar49._10_5_;
      auVar77[8] = auVar173[4];
      auVar77._0_8_ = auVar173._0_8_;
      auVar77._9_6_ = auVar63._9_6_;
      auVar115._7_8_ = 0;
      auVar115._0_7_ = auVar77._8_7_;
      Var116 = CONCAT81(SUB158(auVar115 << 0x40,7),auVar173[3]);
      auVar146._9_6_ = 0;
      auVar146._0_9_ = Var116;
      auVar117._1_10_ = SUB1510(auVar146 << 0x30,5);
      auVar117[0] = auVar173[2];
      auVar147._11_4_ = 0;
      auVar147._0_11_ = auVar117;
      auVar91[2] = auVar173[1];
      auVar91._0_2_ = auVar173._0_2_;
      auVar91._3_12_ = SUB1512(auVar147 << 0x20,3);
      uVar223 = auVar173._0_2_ & 0xff;
      auVar8[0xd] = 0;
      auVar8._0_13_ = auVar174._0_13_;
      auVar8[0xe] = auVar174[7];
      auVar22[0xc] = auVar174[6];
      auVar22._0_12_ = auVar174._0_12_;
      auVar22._13_2_ = auVar8._13_2_;
      auVar36[0xb] = 0;
      auVar36._0_11_ = auVar174._0_11_;
      auVar36._12_3_ = auVar22._12_3_;
      auVar50[10] = auVar174[5];
      auVar50._0_10_ = auVar174._0_10_;
      auVar50._11_4_ = auVar36._11_4_;
      auVar64[9] = 0;
      auVar64._0_9_ = auVar174._0_9_;
      auVar64._10_5_ = auVar50._10_5_;
      auVar78[8] = auVar174[4];
      auVar78._0_8_ = auVar174._0_8_;
      auVar78._9_6_ = auVar64._9_6_;
      auVar118._7_8_ = 0;
      auVar118._0_7_ = auVar78._8_7_;
      Var119 = CONCAT81(SUB158(auVar118 << 0x40,7),auVar174[3]);
      auVar148._9_6_ = 0;
      auVar148._0_9_ = Var119;
      auVar120._1_10_ = SUB1510(auVar148 << 0x30,5);
      auVar120[0] = auVar174[2];
      auVar149._11_4_ = 0;
      auVar149._0_11_ = auVar120;
      auVar92[2] = auVar174[1];
      auVar92._0_2_ = auVar174._0_2_;
      auVar92._3_12_ = SUB1512(auVar149 << 0x20,3);
      uVar226 = auVar174._0_2_ & 0xff;
      auVar9[0xd] = 0;
      auVar9._0_13_ = auVar179._0_13_;
      auVar9[0xe] = auVar179[7];
      auVar23[0xc] = auVar179[6];
      auVar23._0_12_ = auVar179._0_12_;
      auVar23._13_2_ = auVar9._13_2_;
      auVar37[0xb] = 0;
      auVar37._0_11_ = auVar179._0_11_;
      auVar37._12_3_ = auVar23._12_3_;
      auVar51[10] = auVar179[5];
      auVar51._0_10_ = auVar179._0_10_;
      auVar51._11_4_ = auVar37._11_4_;
      auVar65[9] = 0;
      auVar65._0_9_ = auVar179._0_9_;
      auVar65._10_5_ = auVar51._10_5_;
      auVar79[8] = auVar179[4];
      auVar79._0_8_ = auVar179._0_8_;
      auVar79._9_6_ = auVar65._9_6_;
      auVar121._7_8_ = 0;
      auVar121._0_7_ = auVar79._8_7_;
      Var122 = CONCAT81(SUB158(auVar121 << 0x40,7),auVar179[3]);
      auVar150._9_6_ = 0;
      auVar150._0_9_ = Var122;
      auVar123._1_10_ = SUB1510(auVar150 << 0x30,5);
      auVar123[0] = auVar179[2];
      auVar151._11_4_ = 0;
      auVar151._0_11_ = auVar123;
      auVar93[2] = auVar179[1];
      auVar93._0_2_ = auVar179._0_2_;
      auVar93._3_12_ = SUB1512(auVar151 << 0x20,3);
      uVar264 = auVar179._0_2_ & 0xff;
      uVar231 = (ushort)auVar175[8];
      bVar280 = auVar175[10];
      bVar281 = auVar175[0xb];
      bVar282 = auVar175[0xc];
      bVar167 = auVar175[0xd];
      bVar180 = auVar175[0xe];
      bVar181 = auVar175[0xf];
      uVar253 = (ushort)auVar176[8];
      bVar263 = auVar176[10];
      bVar269 = auVar176[0xb];
      bVar270 = auVar176[0xc];
      bVar271 = auVar176[0xd];
      bVar272 = auVar176[0xe];
      bVar273 = auVar176[0xf];
      uVar222 = (ushort)auVar293[8];
      bVar251 = auVar293[9];
      uVar197 = (ushort)auVar177[8];
      bVar274 = auVar177[10];
      bVar275 = auVar177[0xb];
      bVar276 = auVar177[0xc];
      bVar277 = auVar177[0xd];
      bVar278 = auVar177[0xe];
      bVar279 = auVar177[0xf];
      uStack_2a0._0_1_ = auVar172[8];
      uStack_2a0._1_1_ = auVar172[9];
      uStack_29e._0_1_ = auVar172[10];
      uStack_29e._1_1_ = auVar172[0xb];
      uStack_29c._0_1_ = auVar172[0xc];
      uStack_29c._1_1_ = auVar172[0xd];
      uStack_29a._0_1_ = auVar172[0xe];
      uVar219 = (ushort)(byte)uStack_2a0;
      uVar366 = (ushort)auVar173[8];
      uVar337 = (ushort)auVar174[8];
      uVar252 = (ushort)auVar179[8];
      sVar214 = auVar86._2_2_;
      sVar342 = auVar87._2_2_;
      sVar215 = auVar102._0_2_;
      sVar344 = auVar105._0_2_;
      sVar216 = (short)Var101;
      sVar346 = (short)Var104;
      sVar217 = auVar72._8_2_;
      sVar348 = auVar73._8_2_;
      sVar218 = auVar44._10_2_;
      sVar350 = auVar45._10_2_;
      sVar220 = auVar16._12_2_;
      sVar352 = auVar17._12_2_;
      uVar233 = uVar170 >> 8;
      sVar355 = (uVar184 >> 8) + uVar233;
      sVar256 = auVar88._2_2_;
      sVar257 = auVar108._0_2_;
      sVar258 = (short)Var107;
      sVar259 = auVar74._8_2_;
      sVar260 = auVar46._10_2_;
      sVar261 = auVar18._12_2_;
      uVar358 = uVar292 >> 8;
      sVar262 = uVar358 + (uVar184 >> 8);
      sVar294 = auVar89._2_2_;
      sVar326 = auVar90._2_2_;
      sVar295 = auVar111._0_2_;
      sVar327 = auVar114._0_2_;
      sVar296 = (short)Var110;
      sVar328 = (short)Var113;
      sVar297 = auVar75._8_2_;
      sVar329 = auVar76._8_2_;
      sVar298 = auVar47._10_2_;
      sVar330 = auVar48._10_2_;
      sVar299 = auVar19._12_2_;
      sVar331 = auVar20._12_2_;
      uVar301 = uVar169 >> 8;
      sVar332 = (uVar183 >> 8) + uVar301;
      uVar306 = (ushort)auVar175[9];
      uVar334 = (ushort)auVar176[9];
      uVar309 = (ushort)bVar280;
      uVar312 = (ushort)bVar281;
      uVar315 = (ushort)bVar282;
      uVar318 = (ushort)bVar167;
      uVar321 = (ushort)bVar180;
      uVar324 = (ushort)bVar181;
      sVar304 = bVar251 + uVar334;
      uVar373 = (ushort)auVar293[10];
      sVar307 = uVar373 + bVar263;
      uVar375 = (ushort)auVar293[0xb];
      sVar310 = uVar375 + bVar269;
      uVar377 = (ushort)auVar293[0xc];
      sVar313 = uVar377 + bVar270;
      uVar379 = (ushort)auVar293[0xd];
      sVar316 = uVar379 + bVar271;
      uVar381 = (ushort)auVar293[0xe];
      uVar383 = (ushort)auVar293[0xf];
      sVar319 = uVar381 + bVar272;
      sVar322 = uVar383 + bVar273;
      uStack_2a6 = (ushort)uStack_2a0._1_1_;
      uStack_2a4 = (ushort)(byte)uStack_29e;
      uStack_2a2 = (ushort)uStack_29e._1_1_;
      uStack_2a0 = (ushort)(byte)uStack_29c;
      uStack_29e = (ushort)uStack_29c._1_1_;
      uStack_29c = (ushort)(byte)uStack_29a;
      uStack_29a = (ushort)auVar172[0xf];
      uVar202 = (ushort)auVar177[9];
      uVar367 = uVar221 * 2 + uVar360 + uVar221 + uVar208 + uVar207 + uVar235 + uVar360 + 4;
      uVar370 = sVar214 * 2 + sVar342 + sVar214 + sVar326 + sVar294 + sVar256 + sVar342 + 4;
      uVar372 = sVar215 * 2 + sVar344 + sVar215 + sVar327 + sVar295 + sVar257 + sVar344 + 4;
      uVar374 = sVar216 * 2 + sVar346 + sVar216 + sVar328 + sVar296 + sVar258 + sVar346 + 4;
      uVar376 = sVar217 * 2 + sVar348 + sVar217 + sVar329 + sVar297 + sVar259 + sVar348 + 4;
      uVar378 = sVar218 * 2 + sVar350 + sVar218 + sVar330 + sVar298 + sVar260 + sVar350 + 4;
      uVar380 = sVar220 * 2 + sVar352 + sVar220 + sVar331 + sVar299 + sVar261 + sVar352 + 4;
      uVar382 = uVar233 * 2 + sVar355 + sVar332 + sVar262 + 4;
      uVar168 = uVar231 * 2 + uVar253 + uVar231 + uVar219 + uVar197 + uVar222 + uVar253 + 4;
      uVar182 = uVar306 * 2 + uVar334 + uVar306 + uStack_2a6 + uVar202 + sVar304 + 4;
      uVar187 = bVar280 + uVar309 + bVar263 + uVar309 + uStack_2a4 + bVar274 + sVar307 + 4;
      uVar191 = bVar281 + uVar312 + bVar269 + uVar312 + uStack_2a2 + bVar275 + sVar310 + 4;
      uVar195 = bVar282 + uVar315 + bVar270 + uVar315 + uStack_2a0 + bVar276 + sVar313 + 4;
      uVar200 = bVar167 + uVar318 + bVar271 + uVar318 + uStack_29e + bVar277 + sVar316 + 4;
      uVar205 = bVar180 + uVar321 + bVar272 + uVar321 + uStack_29c + bVar278 + sVar319 + 4;
      uVar212 = bVar181 + uVar324 + bVar273 + uVar324 + uStack_29a + bVar279 + sVar322 + 4;
      sStack_296 = auVar91._2_2_;
      sStack_294 = auVar117._0_2_;
      sStack_292 = (short)Var116;
      sStack_290 = auVar77._8_2_;
      sStack_28e = auVar49._10_2_;
      sStack_28c = auVar21._12_2_;
      uVar209 = auVar7._13_2_ >> 8;
      uVar300 = (uVar235 - (uVar360 + uVar221)) + uVar223 + uVar367;
      uVar305 = (sVar256 - (sVar342 + sVar214)) + sStack_296 + uVar370;
      uVar308 = (sVar257 - (sVar344 + sVar215)) + sStack_294 + uVar372;
      uVar311 = (sVar258 - (sVar346 + sVar216)) + sStack_292 + uVar374;
      uVar314 = (sVar259 - (sVar348 + sVar217)) + sStack_290 + uVar376;
      uVar317 = (sVar260 - (sVar350 + sVar218)) + sStack_28e + uVar378;
      uVar320 = (sVar261 - (sVar352 + sVar220)) + sStack_28c + uVar380;
      uVar323 = (uVar358 - sVar355) + uVar209 + uVar382;
      uVar367 = uVar367 >> 3;
      uVar370 = uVar370 >> 3;
      uVar372 = uVar372 >> 3;
      uVar374 = uVar374 >> 3;
      uVar376 = uVar376 >> 3;
      uVar378 = uVar378 >> 3;
      uVar380 = uVar380 >> 3;
      uVar382 = uVar382 >> 3;
      uVar338 = (uVar222 - (uVar253 + uVar231)) + uVar366 + uVar168;
      uVar343 = ((ushort)bVar251 - (uVar334 + uVar306)) + (ushort)auVar173[9] + uVar182;
      uVar345 = (uVar373 - (bVar263 + uVar309)) + (ushort)auVar173[10] + uVar187;
      uVar347 = (uVar375 - (bVar269 + uVar312)) + (ushort)auVar173[0xb] + uVar191;
      uVar349 = (uVar377 - (bVar270 + uVar315)) + (ushort)auVar173[0xc] + uVar195;
      uVar351 = (uVar379 - (bVar271 + uVar318)) + (ushort)auVar173[0xd] + uVar200;
      uVar353 = (uVar381 - (bVar272 + uVar321)) + (ushort)auVar173[0xe] + uVar205;
      uVar356 = (uVar383 - (bVar273 + uVar324)) + (ushort)auVar173[0xf] + uVar212;
      uVar168 = uVar168 >> 3;
      uVar182 = uVar182 >> 3;
      uVar187 = uVar187 >> 3;
      uVar191 = uVar191 >> 3;
      uVar195 = uVar195 >> 3;
      uVar200 = uVar200 >> 3;
      uVar205 = uVar205 >> 3;
      uVar212 = uVar212 >> 3;
      auVar172[1] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
      auVar172[0] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
      auVar172[2] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
      auVar172[3] = (uVar374 != 0) * (uVar374 < 0x100) * (char)uVar374 - (0xff < uVar374);
      auVar172[4] = (uVar376 != 0) * (uVar376 < 0x100) * (char)uVar376 - (0xff < uVar376);
      auVar172[5] = (uVar378 != 0) * (uVar378 < 0x100) * (char)uVar378 - (0xff < uVar378);
      auVar172[6] = (uVar380 != 0) * (uVar380 < 0x100) * (char)uVar380 - (0xff < uVar380);
      auVar172[7] = (uVar382 != 0) * (uVar382 < 0x100) * (char)uVar382 - (0xff < uVar382);
      auVar172[8] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
      auVar172[9] = (uVar182 != 0) * (uVar182 < 0x100) * (char)uVar182 - (0xff < uVar182);
      auVar172[10] = (uVar187 != 0) * (uVar187 < 0x100) * (char)uVar187 - (0xff < uVar187);
      auVar172[0xb] = (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 - (0xff < uVar191);
      auVar172[0xc] = (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar195 - (0xff < uVar195);
      auVar172[0xd] = (uVar200 != 0) * (uVar200 < 0x100) * (char)uVar200 - (0xff < uVar200);
      auVar172[0xe] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
      auVar172[0xf] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
      auVar172 = ~auVar359 & auVar176 | auVar172 & auVar359;
      sStack_226 = auVar92._2_2_;
      sStack_224 = auVar120._0_2_;
      sStack_222 = (short)Var119;
      sStack_220 = auVar78._8_2_;
      sStack_21e = auVar50._10_2_;
      sStack_21c = auVar22._12_2_;
      uVar168 = auVar8._13_2_ >> 8;
      uVar367 = (uVar207 - (uVar235 + uVar221)) + uVar226 + uVar300;
      uVar370 = (sVar294 - (sVar256 + sVar214)) + sStack_226 + uVar305;
      uVar372 = (sVar295 - (sVar257 + sVar215)) + sStack_224 + uVar308;
      uVar374 = (sVar296 - (sVar258 + sVar216)) + sStack_222 + uVar311;
      uVar376 = (sVar297 - (sVar259 + sVar217)) + sStack_220 + uVar314;
      uVar378 = (sVar298 - (sVar260 + sVar218)) + sStack_21e + uVar317;
      uVar380 = (sVar299 - (sVar261 + sVar220)) + sStack_21c + uVar320;
      uVar382 = (uVar301 - (uVar358 + uVar233)) + uVar168 + uVar323;
      uVar300 = uVar300 >> 3;
      uVar305 = uVar305 >> 3;
      uVar308 = uVar308 >> 3;
      uVar311 = uVar311 >> 3;
      uVar314 = uVar314 >> 3;
      uVar317 = uVar317 >> 3;
      uVar320 = uVar320 >> 3;
      uVar323 = uVar323 >> 3;
      uStack_196 = (ushort)auVar174[9];
      uStack_194 = (ushort)auVar174[10];
      uStack_192 = (ushort)auVar174[0xb];
      uStack_190 = (ushort)auVar174[0xc];
      uStack_18e = (ushort)auVar174[0xd];
      uStack_18c = (ushort)auVar174[0xe];
      uStack_18a = (ushort)auVar174[0xf];
      uVar368 = (uVar197 - (uVar222 + uVar231)) + uVar337 + uVar338;
      uVar371 = (uVar202 - (bVar251 + uVar306)) + uStack_196 + uVar343;
      uVar373 = ((ushort)bVar274 - (uVar373 + uVar309)) + uStack_194 + uVar345;
      uVar375 = ((ushort)bVar275 - (uVar375 + uVar312)) + uStack_192 + uVar347;
      uVar377 = ((ushort)bVar276 - (uVar377 + uVar315)) + uStack_190 + uVar349;
      uVar379 = ((ushort)bVar277 - (uVar379 + uVar318)) + uStack_18e + uVar351;
      uVar381 = ((ushort)bVar278 - (uVar381 + uVar321)) + uStack_18c + uVar353;
      uVar383 = ((ushort)bVar279 - (uVar383 + uVar324)) + uStack_18a + uVar356;
      uVar338 = uVar338 >> 3;
      uVar343 = uVar343 >> 3;
      uVar345 = uVar345 >> 3;
      uVar347 = uVar347 >> 3;
      uVar349 = uVar349 >> 3;
      uVar351 = uVar351 >> 3;
      uVar353 = uVar353 >> 3;
      uVar356 = uVar356 >> 3;
      auVar267[1] = (uVar305 != 0) * (uVar305 < 0x100) * (char)uVar305 - (0xff < uVar305);
      auVar267[0] = (uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 - (0xff < uVar300);
      auVar267[2] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
      auVar267[3] = (uVar311 != 0) * (uVar311 < 0x100) * (char)uVar311 - (0xff < uVar311);
      auVar267[4] = (uVar314 != 0) * (uVar314 < 0x100) * (char)uVar314 - (0xff < uVar314);
      auVar267[5] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
      auVar267[6] = (uVar320 != 0) * (uVar320 < 0x100) * (char)uVar320 - (0xff < uVar320);
      auVar267[7] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
      auVar267[8] = (uVar338 != 0) * (uVar338 < 0x100) * (char)uVar338 - (0xff < uVar338);
      auVar267[9] = (uVar343 != 0) * (uVar343 < 0x100) * (char)uVar343 - (0xff < uVar343);
      auVar267[10] = (uVar345 != 0) * (uVar345 < 0x100) * (char)uVar345 - (0xff < uVar345);
      auVar267[0xb] = (uVar347 != 0) * (uVar347 < 0x100) * (char)uVar347 - (0xff < uVar347);
      auVar267[0xc] = (uVar349 != 0) * (uVar349 < 0x100) * (char)uVar349 - (0xff < uVar349);
      auVar267[0xd] = (uVar351 != 0) * (uVar351 < 0x100) * (char)uVar351 - (0xff < uVar351);
      auVar267[0xe] = (uVar353 != 0) * (uVar353 < 0x100) * (char)uVar353 - (0xff < uVar353);
      auVar267[0xf] = (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356);
      auVar171 = ~auVar359 & (auVar171 ^ _DAT_0042cb20) | auVar267 & auVar359;
      uVar183 = uVar183 >> 8;
      sStack_e6 = auVar93._2_2_;
      sStack_e4 = auVar123._0_2_;
      sStack_e2 = (short)Var122;
      sStack_e0 = auVar79._8_2_;
      sStack_de = auVar51._10_2_;
      sStack_dc = auVar23._12_2_;
      uVar358 = auVar9._13_2_ >> 8;
      uVar182 = (uVar208 - (uVar207 + uVar221)) + uVar264 + uVar367;
      uVar187 = (sVar326 - (sVar294 + sVar214)) + sStack_e6 + uVar370;
      uVar191 = (sVar327 - (sVar295 + sVar215)) + sStack_e4 + uVar372;
      uVar195 = (sVar328 - (sVar296 + sVar216)) + sStack_e2 + uVar374;
      uVar200 = (sVar329 - (sVar297 + sVar217)) + sStack_e0 + uVar376;
      uVar205 = (sVar330 - (sVar298 + sVar218)) + sStack_de + uVar378;
      uVar212 = (sVar331 - (sVar299 + sVar220)) + sStack_dc + uVar380;
      uVar233 = (uVar183 - (uVar301 + uVar233)) + uVar358 + uVar382;
      uVar367 = uVar367 >> 3;
      uVar370 = uVar370 >> 3;
      uVar372 = uVar372 >> 3;
      uVar374 = uVar374 >> 3;
      uVar376 = uVar376 >> 3;
      uVar378 = uVar378 >> 3;
      uVar380 = uVar380 >> 3;
      uVar382 = uVar382 >> 3;
      uStack_f6 = (ushort)auVar179[9];
      uStack_f4 = (ushort)auVar179[10];
      uStack_f2 = (ushort)auVar179[0xb];
      uStack_f0 = (ushort)auVar179[0xc];
      uStack_ee = (ushort)auVar179[0xd];
      uStack_ec = (ushort)auVar179[0xe];
      uStack_ea = (ushort)auVar179[0xf];
      uVar301 = (uVar219 - (uVar197 + uVar231)) + uVar252 + uVar368;
      uVar306 = (uStack_2a6 - (uVar202 + uVar306)) + uStack_f6 + uVar371;
      uVar309 = (uStack_2a4 - (bVar274 + uVar309)) + uStack_f4 + uVar373;
      uVar312 = (uStack_2a2 - (bVar275 + uVar312)) + uStack_f2 + uVar375;
      uVar315 = (uStack_2a0 - (bVar276 + uVar315)) + uStack_f0 + uVar377;
      uVar318 = (uStack_29e - (bVar277 + uVar318)) + uStack_ee + uVar379;
      uVar321 = (uStack_29c - (bVar278 + uVar321)) + uStack_ec + uVar381;
      uVar324 = (uStack_29a - (bVar279 + uVar324)) + uStack_ea + uVar383;
      uVar368 = uVar368 >> 3;
      uVar371 = uVar371 >> 3;
      uVar373 = uVar373 >> 3;
      uVar375 = uVar375 >> 3;
      uVar377 = uVar377 >> 3;
      uVar379 = uVar379 >> 3;
      uVar381 = uVar381 >> 3;
      uVar383 = uVar383 >> 3;
      auVar302[1] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
      auVar302[0] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
      auVar302[2] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
      auVar302[3] = (uVar374 != 0) * (uVar374 < 0x100) * (char)uVar374 - (0xff < uVar374);
      auVar302[4] = (uVar376 != 0) * (uVar376 < 0x100) * (char)uVar376 - (0xff < uVar376);
      auVar302[5] = (uVar378 != 0) * (uVar378 < 0x100) * (char)uVar378 - (0xff < uVar378);
      auVar302[6] = (uVar380 != 0) * (uVar380 < 0x100) * (char)uVar380 - (0xff < uVar380);
      auVar302[7] = (uVar382 != 0) * (uVar382 < 0x100) * (char)uVar382 - (0xff < uVar382);
      auVar302[8] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
      auVar302[9] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
      auVar302[10] = (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373);
      auVar302[0xb] = (uVar375 != 0) * (uVar375 < 0x100) * (char)uVar375 - (0xff < uVar375);
      auVar302[0xc] = (uVar377 != 0) * (uVar377 < 0x100) * (char)uVar377 - (0xff < uVar377);
      auVar302[0xd] = (uVar379 != 0) * (uVar379 < 0x100) * (char)uVar379 - (0xff < uVar379);
      auVar302[0xe] = (uVar381 != 0) * (uVar381 < 0x100) * (char)uVar381 - (0xff < uVar381);
      auVar302[0xf] = (uVar383 != 0) * (uVar383 < 0x100) * (char)uVar383 - (0xff < uVar383);
      auVar254 = ~auVar359 & auVar254 | auVar302 & auVar359;
      uVar184 = uVar184 >> 8;
      uStack_2b6 = (ushort)auVar173[9];
      uStack_2b4 = (ushort)auVar173[10];
      uStack_2b2 = (ushort)auVar173[0xb];
      uStack_2b0 = (ushort)auVar173[0xc];
      uStack_2ae = (ushort)auVar173[0xd];
      uStack_2ac = (ushort)auVar173[0xe];
      uStack_2aa = (ushort)auVar173[0xf];
      uVar300 = (uVar223 - (uVar208 + uVar360)) + uVar264 + uVar182;
      uVar305 = (sStack_296 - (sVar326 + sVar342)) + sStack_e6 + uVar187;
      uVar373 = (sStack_294 - (sVar327 + sVar344)) + sStack_e4 + uVar191;
      uVar308 = (sStack_292 - (sVar328 + sVar346)) + sStack_e2 + uVar195;
      uVar375 = (sStack_290 - (sVar329 + sVar348)) + sStack_e0 + uVar200;
      uVar311 = (sStack_28e - (sVar330 + sVar350)) + sStack_de + uVar205;
      uVar377 = (sStack_28c - (sVar331 + sVar352)) + sStack_dc + uVar212;
      uVar314 = (uVar209 - (uVar183 + uVar184)) + uVar358 + uVar233;
      uVar182 = uVar182 >> 3;
      uVar187 = uVar187 >> 3;
      uVar191 = uVar191 >> 3;
      uVar195 = uVar195 >> 3;
      uVar200 = uVar200 >> 3;
      uVar205 = uVar205 >> 3;
      uVar212 = uVar212 >> 3;
      uVar233 = uVar233 >> 3;
      uVar379 = (uVar366 - (uVar219 + uVar253)) + uVar252 + uVar301;
      uVar317 = (uStack_2b6 - (uStack_2a6 + uVar334)) + uStack_f6 + uVar306;
      uVar381 = (uStack_2b4 - (uStack_2a4 + bVar263)) + uStack_f4 + uVar309;
      uVar320 = (uStack_2b2 - (uStack_2a2 + bVar269)) + uStack_f2 + uVar312;
      uVar383 = (uStack_2b0 - (uStack_2a0 + bVar270)) + uStack_f0 + uVar315;
      uVar323 = (uStack_2ae - (uStack_29e + bVar271)) + uStack_ee + uVar318;
      uVar367 = (uStack_2ac - (uStack_29c + bVar272)) + uStack_ec + uVar321;
      uVar370 = (uStack_2aa - (uStack_29a + bVar273)) + uStack_ea + uVar324;
      uVar301 = uVar301 >> 3;
      uVar306 = uVar306 >> 3;
      uVar309 = uVar309 >> 3;
      uVar312 = uVar312 >> 3;
      uVar315 = uVar315 >> 3;
      uVar318 = uVar318 >> 3;
      uVar321 = uVar321 >> 3;
      uVar324 = uVar324 >> 3;
      auVar173[1] = (uVar187 != 0) * (uVar187 < 0x100) * (char)uVar187 - (0xff < uVar187);
      auVar173[0] = (uVar182 != 0) * (uVar182 < 0x100) * (char)uVar182 - (0xff < uVar182);
      auVar173[2] = (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 - (0xff < uVar191);
      auVar173[3] = (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar195 - (0xff < uVar195);
      auVar173[4] = (uVar200 != 0) * (uVar200 < 0x100) * (char)uVar200 - (0xff < uVar200);
      auVar173[5] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
      auVar173[6] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
      auVar173[7] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
      auVar173[8] = (uVar301 != 0) * (uVar301 < 0x100) * (char)uVar301 - (0xff < uVar301);
      auVar173[9] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
      auVar173[10] = (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309);
      auVar173[0xb] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar173[0xc] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
      auVar173[0xd] = (uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 - (0xff < uVar318);
      auVar173[0xe] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
      auVar173[0xf] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
      auVar173 = ~auVar359 & auVar236 | auVar173 & auVar359;
      uVar292 = uVar292 >> 8;
      uStack_256 = (ushort)bVar251;
      uStack_254 = (ushort)auVar293[10];
      uStack_252 = (ushort)auVar293[0xb];
      uStack_250 = (ushort)auVar293[0xc];
      uStack_24e = (ushort)auVar293[0xd];
      uStack_24c = (ushort)auVar293[0xe];
      uStack_24a = (ushort)auVar293[0xf];
      auVar293[1] = -((byte)((bVar186 < bVar234) * bVar186 | (bVar186 >= bVar234) * bVar234) ==
                     bVar186);
      auVar293[0] = -((byte)((bVar185 < bVar283) * bVar185 | (bVar185 >= bVar283) * bVar283) ==
                     bVar185);
      auVar293[2] = -((byte)((bVar189 < bVar237) * bVar189 | (bVar189 >= bVar237) * bVar237) ==
                     bVar189);
      auVar293[3] = -((byte)((bVar190 < bVar238) * bVar190 | (bVar190 >= bVar238) * bVar238) ==
                     bVar190);
      auVar293[4] = -((byte)((bVar193 < bVar239) * bVar193 | (bVar193 >= bVar239) * bVar239) ==
                     bVar193);
      auVar293[5] = -((byte)((bVar194 < bVar240) * bVar194 | (bVar194 >= bVar240) * bVar240) ==
                     bVar194);
      auVar293[6] = -((byte)((bVar198 < bVar241) * bVar198 | (bVar198 >= bVar241) * bVar241) ==
                     bVar198);
      auVar293[7] = -((byte)((bVar199 < bVar242) * bVar199 | (bVar199 >= bVar242) * bVar242) ==
                     bVar199);
      auVar293[8] = -((byte)((bVar203 < bVar243) * bVar203 | (bVar203 >= bVar243) * bVar243) ==
                     bVar203);
      auVar293[9] = -((byte)((bVar204 < bVar244) * bVar204 | (bVar204 >= bVar244) * bVar244) ==
                     bVar204);
      auVar293[10] = -((byte)((bVar210 < bVar245) * bVar210 | (bVar210 >= bVar245) * bVar245) ==
                      bVar210);
      auVar293[0xb] =
           -((byte)((bVar211 < bVar246) * bVar211 | (bVar211 >= bVar246) * bVar246) == bVar211);
      auVar293[0xc] =
           -((byte)((bVar213 < bVar247) * bVar213 | (bVar213 >= bVar247) * bVar247) == bVar213);
      auVar293[0xd] =
           -((byte)((bVar284 < bVar248) * bVar284 | (bVar284 >= bVar248) * bVar248) == bVar284);
      auVar293[0xe] =
           -((byte)((bVar354 < bVar249) * bVar354 | (bVar354 >= bVar249) * bVar249) == bVar354);
      auVar293[0xf] =
           -((byte)((bVar357 < bVar250) * bVar357 | (bVar357 >= bVar250) * bVar250) == bVar357);
      uVar233 = uVar300 >> 3;
      uVar301 = uVar305 >> 3;
      uVar182 = uVar373 >> 3;
      uVar187 = uVar308 >> 3;
      uVar191 = uVar375 >> 3;
      uVar195 = uVar311 >> 3;
      uVar200 = uVar377 >> 3;
      uVar205 = uVar314 >> 3;
      uVar212 = uVar379 >> 3;
      uVar306 = uVar317 >> 3;
      uVar309 = uVar381 >> 3;
      uVar312 = uVar320 >> 3;
      uVar315 = uVar383 >> 3;
      uVar318 = uVar323 >> 3;
      uVar321 = uVar367 >> 3;
      uVar324 = uVar370 >> 3;
      auVar303[1] = (uVar301 != 0) * (uVar301 < 0x100) * (char)uVar301 - (0xff < uVar301);
      auVar303[0] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
      auVar303[2] = (uVar182 != 0) * (uVar182 < 0x100) * (char)uVar182 - (0xff < uVar182);
      auVar303[3] = (uVar187 != 0) * (uVar187 < 0x100) * (char)uVar187 - (0xff < uVar187);
      auVar303[4] = (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 - (0xff < uVar191);
      auVar303[5] = (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar195 - (0xff < uVar195);
      auVar303[6] = (uVar200 != 0) * (uVar200 < 0x100) * (char)uVar200 - (0xff < uVar200);
      auVar303[7] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
      auVar303[8] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
      auVar303[9] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
      auVar303[10] = (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309);
      auVar303[0xb] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar303[0xc] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
      auVar303[0xd] = (uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 - (0xff < uVar318);
      auVar303[0xe] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
      auVar303[0xf] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
      auVar224 = ~auVar359 & auVar224 | auVar303 & auVar359;
      uVar212 = (ushort)((uVar226 - (uVar223 + uVar235)) + uVar264 + uVar300) >> 3;
      uVar306 = (ushort)((sStack_226 - (sStack_296 + sVar256)) + sStack_e6 + uVar305) >> 3;
      uVar309 = (ushort)((sStack_224 - (sStack_294 + sVar257)) + sStack_e4 + uVar373) >> 3;
      uVar312 = (ushort)((sStack_222 - (sStack_292 + sVar258)) + sStack_e2 + uVar308) >> 3;
      uVar315 = (ushort)((sStack_220 - (sStack_290 + sVar259)) + sStack_e0 + uVar375) >> 3;
      uVar318 = (ushort)((sStack_21e - (sStack_28e + sVar260)) + sStack_de + uVar311) >> 3;
      uVar321 = (ushort)((sStack_21c - (sStack_28c + sVar261)) + sStack_dc + uVar377) >> 3;
      uVar324 = (ushort)((uVar168 - (uVar209 + uVar292)) + uVar358 + uVar314) >> 3;
      uVar233 = (ushort)((uVar337 - (uVar366 + uVar222)) + uVar252 + uVar379) >> 3;
      uVar301 = (ushort)((uStack_196 - (uStack_2b6 + uStack_256)) + uStack_f6 + uVar317) >> 3;
      uVar182 = (ushort)((uStack_194 - (uStack_2b4 + uStack_254)) + uStack_f4 + uVar381) >> 3;
      uVar187 = (ushort)((uStack_192 - (uStack_2b2 + uStack_252)) + uStack_f2 + uVar320) >> 3;
      uVar191 = (ushort)((uStack_190 - (uStack_2b0 + uStack_250)) + uStack_f0 + uVar383) >> 3;
      uVar195 = (ushort)((uStack_18e - (uStack_2ae + uStack_24e)) + uStack_ee + uVar323) >> 3;
      uVar200 = (ushort)((uStack_18c - (uStack_2ac + uStack_24c)) + uStack_ec + uVar367) >> 3;
      uVar205 = (ushort)((uStack_18a - (uStack_2aa + uStack_24a)) + uStack_ea + uVar370) >> 3;
      auVar363[1] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
      auVar363[0] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
      auVar363[2] = (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309);
      auVar363[3] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
      auVar363[4] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
      auVar363[5] = (uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 - (0xff < uVar318);
      auVar363[6] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
      auVar363[7] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
      auVar363[8] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
      auVar363[9] = (uVar301 != 0) * (uVar301 < 0x100) * (char)uVar301 - (0xff < uVar301);
      auVar363[10] = (uVar182 != 0) * (uVar182 < 0x100) * (char)uVar182 - (0xff < uVar182);
      auVar363[0xb] = (uVar187 != 0) * (uVar187 < 0x100) * (char)uVar187 - (0xff < uVar187);
      auVar363[0xc] = (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 - (0xff < uVar191);
      auVar363[0xd] = (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar195 - (0xff < uVar195);
      auVar363[0xe] = (uVar200 != 0) * (uVar200 < 0x100) * (char)uVar200 - (0xff < uVar200);
      auVar363[0xf] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
      auVar293 = auVar293 & auVar359;
      auVar236 = ~auVar359 & auVar174 | auVar363 & auVar359;
      auVar174 = psllw(auVar293,7);
      if ((((((((((((((((auVar174 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar174 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar174 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar174 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar174 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar174 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar174 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar174 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar174 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar174 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar174 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar174 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar174 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar174 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar174 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar174[0xf]
         ) {
        local_158 = auVar172._0_8_;
        uStack_150 = auVar172._8_8_;
        *(undefined8 *)(s + lVar166 * -3) = local_158;
        *(undefined8 *)(s + lVar166 * -3 + 8) = uStack_150;
        local_168 = auVar171._0_8_;
        uStack_160 = auVar171._8_8_;
        *(undefined8 *)(s + lVar165) = local_168;
        *(undefined8 *)(s + lVar165 + 8) = uStack_160;
        *(undefined1 (*) [16])(s + lVar164) = auVar254;
        local_178 = auVar173._0_8_;
        uStack_170 = auVar173._8_8_;
        *(undefined8 *)s = local_178;
        *(undefined8 *)(s + 8) = uStack_170;
        *(undefined1 (*) [16])(s + lVar166) = auVar224;
        local_218 = auVar236._0_8_;
        uStack_210 = auVar236._8_8_;
        *(undefined8 *)(s + lVar166 * 2) = local_218;
        *(undefined8 *)(s + lVar166 * 2 + 8) = uStack_210;
      }
      else {
        auVar10[0xd] = 0;
        auVar10._0_13_ = auVar255._0_13_;
        auVar10[0xe] = auVar255[7];
        uVar233 = auVar10._13_2_;
        auVar24[0xc] = auVar255[6];
        auVar24._0_12_ = auVar255._0_12_;
        auVar24._13_2_ = uVar233;
        auVar38[0xb] = 0;
        auVar38._0_11_ = auVar255._0_11_;
        auVar38._12_3_ = auVar24._12_3_;
        auVar52[10] = auVar255[5];
        auVar52._0_10_ = auVar255._0_10_;
        auVar52._11_4_ = auVar38._11_4_;
        auVar66[9] = 0;
        auVar66._0_9_ = auVar255._0_9_;
        auVar66._10_5_ = auVar52._10_5_;
        auVar80[8] = auVar255[4];
        auVar80._0_8_ = auVar255._0_8_;
        auVar80._9_6_ = auVar66._9_6_;
        auVar124._7_8_ = 0;
        auVar124._0_7_ = auVar80._8_7_;
        Var101 = CONCAT81(SUB158(auVar124 << 0x40,7),auVar255[3]);
        auVar152._9_6_ = 0;
        auVar152._0_9_ = Var101;
        auVar125._1_10_ = SUB1510(auVar152 << 0x30,5);
        auVar125[0] = auVar255[2];
        auVar153._11_4_ = 0;
        auVar153._0_11_ = auVar125;
        auVar94[2] = auVar255[1];
        auVar94._0_2_ = auVar255._0_2_;
        auVar94._3_12_ = SUB1512(auVar153 << 0x20,3);
        uVar308 = auVar255._0_2_ & 0xff;
        auVar11[0xd] = 0;
        auVar11._0_13_ = auVar339._0_13_;
        auVar11[0xe] = auVar339[7];
        uVar301 = auVar11._13_2_;
        auVar25[0xc] = auVar339[6];
        auVar25._0_12_ = auVar339._0_12_;
        auVar25._13_2_ = uVar301;
        auVar39[0xb] = 0;
        auVar39._0_11_ = auVar339._0_11_;
        auVar39._12_3_ = auVar25._12_3_;
        auVar53[10] = auVar339[5];
        auVar53._0_10_ = auVar339._0_10_;
        auVar53._11_4_ = auVar39._11_4_;
        auVar67[9] = 0;
        auVar67._0_9_ = auVar339._0_9_;
        auVar67._10_5_ = auVar53._10_5_;
        auVar81[8] = auVar339[4];
        auVar81._0_8_ = auVar339._0_8_;
        auVar81._9_6_ = auVar67._9_6_;
        auVar126._7_8_ = 0;
        auVar126._0_7_ = auVar81._8_7_;
        Var104 = CONCAT81(SUB158(auVar126 << 0x40,7),auVar339[3]);
        auVar154._9_6_ = 0;
        auVar154._0_9_ = Var104;
        auVar127._1_10_ = SUB1510(auVar154 << 0x30,5);
        auVar127[0] = auVar339[2];
        auVar155._11_4_ = 0;
        auVar155._0_11_ = auVar127;
        auVar95[2] = auVar339[1];
        auVar95._0_2_ = auVar339._0_2_;
        auVar95._3_12_ = SUB1512(auVar155 << 0x20,3);
        uVar345 = auVar339._0_2_ & 0xff;
        auVar12[0xd] = 0;
        auVar12._0_13_ = auVar265._0_13_;
        auVar12[0xe] = auVar265[7];
        uVar182 = auVar12._13_2_;
        auVar26[0xc] = auVar265[6];
        auVar26._0_12_ = auVar265._0_12_;
        auVar26._13_2_ = uVar182;
        auVar40[0xb] = 0;
        auVar40._0_11_ = auVar265._0_11_;
        auVar40._12_3_ = auVar26._12_3_;
        auVar54[10] = auVar265[5];
        auVar54._0_10_ = auVar265._0_10_;
        auVar54._11_4_ = auVar40._11_4_;
        auVar68[9] = 0;
        auVar68._0_9_ = auVar265._0_9_;
        auVar68._10_5_ = auVar54._10_5_;
        auVar82[8] = auVar265[4];
        auVar82._0_8_ = auVar265._0_8_;
        auVar82._9_6_ = auVar68._9_6_;
        auVar128._7_8_ = 0;
        auVar128._0_7_ = auVar82._8_7_;
        Var107 = CONCAT81(SUB158(auVar128 << 0x40,7),auVar265[3]);
        auVar156._9_6_ = 0;
        auVar156._0_9_ = Var107;
        auVar129._1_10_ = SUB1510(auVar156 << 0x30,5);
        auVar129[0] = auVar265[2];
        auVar157._11_4_ = 0;
        auVar157._0_11_ = auVar129;
        auVar96[2] = auVar265[1];
        auVar96._0_2_ = auVar265._0_2_;
        auVar96._3_12_ = SUB1512(auVar157 << 0x20,3);
        uVar375 = auVar265._0_2_ & 0xff;
        auVar13[0xd] = 0;
        auVar13._0_13_ = auVar266._0_13_;
        auVar13[0xe] = auVar266[7];
        auVar27[0xc] = auVar266[6];
        auVar27._0_12_ = auVar266._0_12_;
        auVar27._13_2_ = auVar13._13_2_;
        auVar41[0xb] = 0;
        auVar41._0_11_ = auVar266._0_11_;
        auVar41._12_3_ = auVar27._12_3_;
        auVar55[10] = auVar266[5];
        auVar55._0_10_ = auVar266._0_10_;
        auVar55._11_4_ = auVar41._11_4_;
        auVar69[9] = 0;
        auVar69._0_9_ = auVar266._0_9_;
        auVar69._10_5_ = auVar55._10_5_;
        auVar83[8] = auVar266[4];
        auVar83._0_8_ = auVar266._0_8_;
        auVar83._9_6_ = auVar69._9_6_;
        auVar130._7_8_ = 0;
        auVar130._0_7_ = auVar83._8_7_;
        Var110 = CONCAT81(SUB158(auVar130 << 0x40,7),auVar266[3]);
        auVar158._9_6_ = 0;
        auVar158._0_9_ = Var110;
        auVar131._1_10_ = SUB1510(auVar158 << 0x30,5);
        auVar131[0] = auVar266[2];
        auVar159._11_4_ = 0;
        auVar159._0_11_ = auVar131;
        auVar97[2] = auVar266[1];
        auVar97._0_2_ = auVar266._0_2_;
        auVar97._3_12_ = SUB1512(auVar159 << 0x20,3);
        uVar361 = auVar266._0_2_ & 0xff;
        auVar14[0xd] = 0;
        auVar14._0_13_ = auVar340._0_13_;
        auVar14[0xe] = auVar340[7];
        auVar28[0xc] = auVar340[6];
        auVar28._0_12_ = auVar340._0_12_;
        auVar28._13_2_ = auVar14._13_2_;
        auVar42[0xb] = 0;
        auVar42._0_11_ = auVar340._0_11_;
        auVar42._12_3_ = auVar28._12_3_;
        auVar56[10] = auVar340[5];
        auVar56._0_10_ = auVar340._0_10_;
        auVar56._11_4_ = auVar42._11_4_;
        auVar70[9] = 0;
        auVar70._0_9_ = auVar340._0_9_;
        auVar70._10_5_ = auVar56._10_5_;
        auVar84[8] = auVar340[4];
        auVar84._0_8_ = auVar340._0_8_;
        auVar84._9_6_ = auVar70._9_6_;
        auVar132._7_8_ = 0;
        auVar132._0_7_ = auVar84._8_7_;
        Var113 = CONCAT81(SUB158(auVar132 << 0x40,7),auVar340[3]);
        auVar160._9_6_ = 0;
        auVar160._0_9_ = Var113;
        auVar133._1_10_ = SUB1510(auVar160 << 0x30,5);
        auVar133[0] = auVar340[2];
        auVar161._11_4_ = 0;
        auVar161._0_11_ = auVar133;
        auVar98[2] = auVar340[1];
        auVar98._0_2_ = auVar340._0_2_;
        auVar98._3_12_ = SUB1512(auVar161 << 0x20,3);
        uVar311 = auVar340._0_2_ & 0xff;
        auVar15[0xd] = 0;
        auVar15._0_13_ = auVar178._0_13_;
        auVar15[0xe] = auVar178[7];
        auVar29[0xc] = auVar178[6];
        auVar29._0_12_ = auVar178._0_12_;
        auVar29._13_2_ = auVar15._13_2_;
        auVar43[0xb] = 0;
        auVar43._0_11_ = auVar178._0_11_;
        auVar43._12_3_ = auVar29._12_3_;
        auVar57[10] = auVar178[5];
        auVar57._0_10_ = auVar178._0_10_;
        auVar57._11_4_ = auVar43._11_4_;
        auVar71[9] = 0;
        auVar71._0_9_ = auVar178._0_9_;
        auVar71._10_5_ = auVar57._10_5_;
        auVar85[8] = auVar178[4];
        auVar85._0_8_ = auVar178._0_8_;
        auVar85._9_6_ = auVar71._9_6_;
        auVar134._7_8_ = 0;
        auVar134._0_7_ = auVar85._8_7_;
        Var116 = CONCAT81(SUB158(auVar134 << 0x40,7),auVar178[3]);
        auVar162._9_6_ = 0;
        auVar162._0_9_ = Var116;
        auVar135._1_10_ = SUB1510(auVar162 << 0x30,5);
        auVar135[0] = auVar178[2];
        auVar163._11_4_ = 0;
        auVar163._0_11_ = auVar135;
        auVar99[2] = auVar178[1];
        auVar99._0_2_ = auVar178._0_2_;
        auVar99._3_12_ = SUB1512(auVar163 << 0x20,3);
        uVar377 = auVar178._0_2_ & 0xff;
        uVar317 = (ushort)auVar255[8];
        bVar283 = auVar255[10];
        bVar234 = auVar255[0xb];
        bVar237 = auVar255[0xc];
        bVar238 = auVar255[0xd];
        bVar239 = auVar255[0xe];
        bVar240 = auVar255[0xf];
        uVar314 = (ushort)auVar339[8];
        uVar347 = (ushort)auVar265[8];
        uVar325 = (ushort)auVar178[8];
        uVar170 = uVar170 >> 8;
        sVar355 = auVar96._2_2_;
        sVar286 = auVar95._2_2_;
        sVar188 = auVar129._0_2_;
        sVar287 = auVar127._0_2_;
        sVar192 = (short)Var107;
        sVar288 = (short)Var104;
        sVar196 = auVar82._8_2_;
        sVar289 = auVar81._8_2_;
        sVar201 = auVar54._10_2_;
        sVar290 = auVar53._10_2_;
        sVar206 = auVar26._12_2_;
        sVar291 = auVar25._12_2_;
        sVar225 = auVar94._2_2_;
        sVar227 = auVar125._0_2_;
        sVar228 = (short)Var101;
        sVar229 = auVar80._8_2_;
        sVar230 = auVar52._10_2_;
        sVar232 = auVar24._12_2_;
        uVar187 = uVar233 >> 8;
        uVar370 = uVar235 + uVar360 + uVar221 + uVar208 + uVar207 + (uVar375 + uVar345) * 2 + 8 +
                  uVar308 * 7;
        uVar372 = sVar256 + sVar342 + sVar214 + sVar326 + sVar294 + (sVar355 + sVar286) * 2 + 8 +
                  sVar225 * 7;
        uVar374 = sVar257 + sVar344 + sVar215 + sVar327 + sVar295 + (sVar188 + sVar287) * 2 + 8 +
                  sVar227 * 7;
        uVar376 = sVar258 + sVar346 + sVar216 + sVar328 + sVar296 + (sVar192 + sVar288) * 2 + 8 +
                  sVar228 * 7;
        uVar378 = sVar259 + sVar348 + sVar217 + sVar329 + sVar297 + (sVar196 + sVar289) * 2 + 8 +
                  sVar229 * 7;
        uVar380 = sVar260 + sVar350 + sVar218 + sVar330 + sVar298 + (sVar201 + sVar290) * 2 + 8 +
                  sVar230 * 7;
        uVar382 = sVar261 + sVar352 + sVar220 + sVar331 + sVar299 + (sVar206 + sVar291) * 2 + 8 +
                  sVar232 * 7;
        uVar338 = sVar262 + uVar170 + sVar332 + ((uVar182 >> 8) + (uVar301 >> 8)) * 2 + 8 +
                  uVar187 * 7;
        uStack_136 = (ushort)auVar175[9];
        uStack_134 = (ushort)bVar280;
        uStack_132 = (ushort)bVar281;
        uStack_130 = (ushort)bVar282;
        uStack_12e = (ushort)bVar167;
        uStack_12c = (ushort)bVar180;
        uStack_12a = (ushort)bVar181;
        uVar379 = (ushort)auVar255[9];
        uVar381 = (ushort)bVar283;
        uVar320 = (ushort)bVar234;
        uVar383 = (ushort)bVar237;
        uVar323 = (ushort)bVar238;
        uVar367 = (ushort)bVar239;
        uVar343 = uVar222 + uVar253 + uVar231 + uVar219 + uVar197 + (uVar347 + uVar314) * 2 + 8 +
                  uVar317 * 7;
        uVar349 = sVar304 + uStack_136 + uStack_2a6 + uVar202 +
                  ((ushort)auVar265[9] + (ushort)auVar339[9]) * 2 + 8 + uVar379 * 7;
        uVar351 = sVar307 + uStack_134 + uStack_2a4 + bVar274 +
                  ((ushort)auVar265[10] + (ushort)auVar339[10]) * 2 + 8 + uVar381 * 7;
        uVar353 = sVar310 + uStack_132 + uStack_2a2 + bVar275 +
                  ((ushort)auVar265[0xb] + (ushort)auVar339[0xb]) * 2 + 8 + uVar320 * 7;
        uVar356 = sVar313 + uStack_130 + uStack_2a0 + bVar276 +
                  ((ushort)auVar265[0xc] + (ushort)auVar339[0xc]) * 2 + 8 + uVar383 * 7;
        uVar334 = sVar316 + uStack_12e + uStack_29e + bVar277 +
                  ((ushort)auVar265[0xd] + (ushort)auVar339[0xd]) * 2 + 8 + uVar323 * 7;
        uVar368 = sVar319 + uStack_12c + uStack_29c + bVar278 +
                  ((ushort)auVar265[0xe] + (ushort)auVar339[0xe]) * 2 + 8 + uVar367 * 7;
        uVar335 = sVar322 + uStack_12a + uStack_29a + bVar279 +
                  ((ushort)auVar265[0xf] + (ushort)auVar339[0xf]) * 2 + 8 + (ushort)bVar240 * 7;
        uVar191 = uVar370 >> 4;
        uVar195 = uVar372 >> 4;
        uVar200 = uVar374 >> 4;
        uVar205 = uVar376 >> 4;
        uVar212 = uVar378 >> 4;
        uVar202 = uVar380 >> 4;
        uVar306 = uVar382 >> 4;
        uVar309 = uVar338 >> 4;
        uVar312 = uVar343 >> 4;
        uVar315 = uVar349 >> 4;
        uVar318 = uVar351 >> 4;
        uVar321 = uVar353 >> 4;
        uVar324 = uVar356 >> 4;
        uVar300 = uVar334 >> 4;
        uVar305 = uVar368 >> 4;
        uVar373 = uVar335 >> 4;
        auVar174[1] = (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar195 - (0xff < uVar195);
        auVar174[0] = (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 - (0xff < uVar191);
        auVar174[2] = (uVar200 != 0) * (uVar200 < 0x100) * (char)uVar200 - (0xff < uVar200);
        auVar174[3] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
        auVar174[4] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
        auVar174[5] = (uVar202 != 0) * (uVar202 < 0x100) * (char)uVar202 - (0xff < uVar202);
        auVar174[6] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
        auVar174[7] = (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309);
        auVar174[8] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
        auVar174[9] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
        auVar174[10] = (uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 - (0xff < uVar318);
        auVar174[0xb] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
        auVar174[0xc] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
        auVar174[0xd] = (uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 - (0xff < uVar300);
        auVar174[0xe] = (uVar305 != 0) * (uVar305 < 0x100) * (char)uVar305 - (0xff < uVar305);
        auVar174[0xf] = (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373);
        *(undefined1 (*) [16])(s + lVar166 * -6) = ~auVar293 & auVar339 | auVar174 & auVar293;
        sVar262 = (short)Var110;
        uVar191 = auVar13._13_2_ >> 8;
        uVar370 = uVar223 + uVar221 + uVar308 * -2 + uVar370;
        uVar372 = sStack_296 + sVar214 + sVar225 * -2 + uVar372;
        uVar374 = sStack_294 + sVar215 + sVar227 * -2 + uVar374;
        uVar376 = sStack_292 + sVar216 + sVar228 * -2 + uVar376;
        uVar378 = sStack_290 + sVar217 + sVar229 * -2 + uVar378;
        uVar380 = sStack_28e + sVar218 + sVar230 * -2 + uVar380;
        uVar382 = sStack_28c + sVar220 + sVar232 * -2 + uVar382;
        uVar338 = uVar209 + uVar170 + uVar187 * -2 + uVar338;
        uStack_236 = (ushort)auVar177[9];
        uStack_234 = (ushort)bVar274;
        uStack_232 = (ushort)bVar275;
        uStack_230 = (ushort)bVar276;
        uStack_22e = (ushort)bVar277;
        uStack_22c = (ushort)bVar278;
        uStack_22a = (ushort)bVar279;
        uVar343 = uVar366 + uVar231 + uVar317 * -2 + uVar343;
        uVar349 = uStack_2b6 + uStack_136 + uVar379 * -2 + uVar349;
        uVar351 = ((uStack_2b4 + uStack_134) - (bVar283 + uVar381)) + uVar351;
        uVar353 = ((uStack_2b2 + uStack_132) - (bVar234 + uVar320)) + uVar353;
        uVar356 = ((uStack_2b0 + uStack_130) - (bVar237 + uVar383)) + uVar356;
        uVar334 = ((uStack_2ae + uStack_12e) - (bVar238 + uVar323)) + uVar334;
        uVar368 = ((uStack_2ac + uStack_12c) - (bVar239 + uVar367)) + uVar368;
        uVar335 = ((uStack_2aa + uStack_12a) - ((ushort)bVar240 + (ushort)bVar240)) + uVar335;
        sStack_266 = auVar98._2_2_;
        sStack_264 = auVar133._0_2_;
        sStack_262 = (short)Var113;
        sStack_260 = auVar84._8_2_;
        sStack_25e = auVar56._10_2_;
        sStack_25c = auVar28._12_2_;
        uVar195 = auVar14._13_2_ >> 8;
        uStack_246 = (ushort)auVar176[9];
        uStack_244 = (ushort)bVar263;
        uStack_242 = (ushort)bVar269;
        uStack_240 = (ushort)bVar270;
        uStack_23e = (ushort)bVar271;
        uStack_23c = (ushort)bVar272;
        uStack_23a = (ushort)bVar273;
        uStack_186 = (ushort)auVar339[9];
        uStack_184 = (ushort)auVar339[10];
        uStack_182 = (ushort)auVar339[0xb];
        uStack_180 = (ushort)auVar339[0xc];
        uStack_17e = (ushort)auVar339[0xd];
        uStack_17c = (ushort)auVar339[0xe];
        uStack_17a = (ushort)auVar339[0xf];
        uStack_2c6 = (ushort)auVar340[9];
        uStack_2c4 = (ushort)auVar340[10];
        uStack_2c2 = (ushort)auVar340[0xb];
        uStack_2c0 = (ushort)auVar340[0xc];
        uStack_2be = (ushort)auVar340[0xd];
        uStack_2bc = (ushort)auVar340[0xe];
        uStack_2ba = (ushort)auVar340[0xf];
        uVar318 = ((uVar360 + uVar226) - (uVar345 + uVar308)) + uVar370;
        uVar321 = ((sVar342 + sStack_226) - (sVar286 + sVar225)) + uVar372;
        uVar324 = ((sVar344 + sStack_224) - (sVar287 + sVar227)) + uVar374;
        uVar300 = ((sVar346 + sStack_222) - (sVar288 + sVar228)) + uVar376;
        uVar305 = ((sVar348 + sStack_220) - (sVar289 + sVar229)) + uVar378;
        uVar373 = ((sVar350 + sStack_21e) - (sVar290 + sVar230)) + uVar380;
        uVar371 = ((sVar352 + sStack_21c) - (sVar291 + sVar232)) + uVar382;
        uVar336 = ((uVar184 + uVar168) - ((uVar301 >> 8) + uVar187)) + uVar338;
        uVar370 = uVar370 >> 4;
        uVar372 = uVar372 >> 4;
        uVar374 = uVar374 >> 4;
        uVar376 = uVar376 >> 4;
        uVar378 = uVar378 >> 4;
        uVar380 = uVar380 >> 4;
        uVar382 = uVar382 >> 4;
        uVar338 = uVar338 >> 4;
        uVar362 = ((uVar253 + uVar337) - (uVar314 + uVar317)) + uVar343;
        uVar364 = ((uStack_246 + uStack_196) - (uStack_186 + uVar379)) + uVar349;
        uVar381 = ((uStack_244 + uStack_194) - (uStack_184 + uVar381)) + uVar351;
        uVar320 = ((uStack_242 + uStack_192) - (uStack_182 + uVar320)) + uVar353;
        uVar383 = ((uStack_240 + uStack_190) - (uStack_180 + uVar383)) + uVar356;
        uVar323 = ((uStack_23e + uStack_18e) - (uStack_17e + uVar323)) + uVar334;
        uVar367 = ((uStack_23c + uStack_18c) - (uStack_17c + uVar367)) + uVar368;
        uVar365 = ((uStack_23a + uStack_18a) - (uStack_17a + bVar240)) + uVar335;
        uVar343 = uVar343 >> 4;
        uVar349 = uVar349 >> 4;
        uVar351 = uVar351 >> 4;
        uVar353 = uVar353 >> 4;
        uVar356 = uVar356 >> 4;
        uVar334 = uVar334 >> 4;
        uVar368 = uVar368 >> 4;
        uVar335 = uVar335 >> 4;
        auVar369[1] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
        auVar369[0] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
        auVar369[2] = (uVar374 != 0) * (uVar374 < 0x100) * (char)uVar374 - (0xff < uVar374);
        auVar369[3] = (uVar376 != 0) * (uVar376 < 0x100) * (char)uVar376 - (0xff < uVar376);
        auVar369[4] = (uVar378 != 0) * (uVar378 < 0x100) * (char)uVar378 - (0xff < uVar378);
        auVar369[5] = (uVar380 != 0) * (uVar380 < 0x100) * (char)uVar380 - (0xff < uVar380);
        auVar369[6] = (uVar382 != 0) * (uVar382 < 0x100) * (char)uVar382 - (0xff < uVar382);
        auVar369[7] = (uVar338 != 0) * (uVar338 < 0x100) * (char)uVar338 - (0xff < uVar338);
        auVar369[8] = (uVar343 != 0) * (uVar343 < 0x100) * (char)uVar343 - (0xff < uVar343);
        auVar369[9] = (uVar349 != 0) * (uVar349 < 0x100) * (char)uVar349 - (0xff < uVar349);
        auVar369[10] = (uVar351 != 0) * (uVar351 < 0x100) * (char)uVar351 - (0xff < uVar351);
        auVar369[0xb] = (uVar353 != 0) * (uVar353 < 0x100) * (char)uVar353 - (0xff < uVar353);
        auVar369[0xc] = (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356);
        auVar369[0xd] = (uVar334 != 0) * (uVar334 < 0x100) * (char)uVar334 - (0xff < uVar334);
        auVar369[0xe] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
        auVar369[0xf] = (uVar335 != 0) * (uVar335 < 0x100) * (char)uVar335 - (0xff < uVar335);
        *(undefined1 (*) [16])(s + lVar166 * -5) = ~auVar293 & auVar265 | auVar369 & auVar293;
        sStack_76 = auVar99._2_2_;
        sStack_74 = auVar135._0_2_;
        sStack_72 = (short)Var116;
        sStack_70 = auVar85._8_2_;
        sStack_6e = auVar57._10_2_;
        sStack_6c = auVar29._12_2_;
        uVar200 = auVar15._13_2_ >> 8;
        uStack_86 = (ushort)auVar265[9];
        uStack_84 = (ushort)auVar265[10];
        uStack_82 = (ushort)auVar265[0xb];
        uStack_80 = (ushort)auVar265[0xc];
        uStack_7e = (ushort)auVar265[0xd];
        uStack_7c = (ushort)auVar265[0xe];
        uStack_7a = (ushort)auVar265[0xf];
        uStack_1e6 = (ushort)auVar255[9];
        uStack_1e4 = (ushort)bVar283;
        uStack_1e2 = (ushort)bVar234;
        uStack_1e0 = (ushort)bVar237;
        uStack_1de = (ushort)bVar238;
        uStack_1dc = (ushort)bVar239;
        uStack_1da = (ushort)bVar240;
        uStack_1d6 = (ushort)auVar178[9];
        uStack_1d4 = (ushort)auVar178[10];
        uStack_1d2 = (ushort)auVar178[0xb];
        uStack_1d0 = (ushort)auVar178[0xc];
        uStack_1ce = (ushort)auVar178[0xd];
        uStack_1cc = (ushort)auVar178[0xe];
        uStack_1ca = (ushort)auVar178[0xf];
        uVar379 = ((uVar235 + uVar264) - (uVar375 + uVar308)) + uVar318;
        uVar370 = ((sVar256 + sStack_e6) - (sVar355 + sVar225)) + uVar321;
        uVar349 = ((sVar257 + sStack_e4) - (sVar188 + sVar227)) + uVar324;
        uVar351 = ((sVar258 + sStack_e2) - (sVar192 + sVar228)) + uVar300;
        uVar353 = ((sVar259 + sStack_e0) - (sVar196 + sVar229)) + uVar305;
        uVar356 = ((sVar260 + sStack_de) - (sVar201 + sVar230)) + uVar373;
        uVar334 = ((sVar261 + sStack_dc) - (sVar206 + sVar232)) + uVar371;
        uVar368 = ((uVar292 + uVar358) - ((uVar182 >> 8) + uVar187)) + uVar336;
        uVar318 = uVar318 >> 4;
        uVar321 = uVar321 >> 4;
        uVar324 = uVar324 >> 4;
        uVar300 = uVar300 >> 4;
        uVar305 = uVar305 >> 4;
        uVar373 = uVar373 >> 4;
        uVar371 = uVar371 >> 4;
        uVar336 = uVar336 >> 4;
        uVar187 = ((uVar222 + uVar252) - (uVar347 + uVar317)) + uVar362;
        uVar205 = ((uStack_256 + uStack_f6) - (uStack_86 + uStack_1e6)) + uVar364;
        uVar212 = ((uStack_254 + uStack_f4) - (uStack_84 + uStack_1e4)) + uVar381;
        uVar202 = ((uStack_252 + uStack_f2) - (uStack_82 + uStack_1e2)) + uVar320;
        uVar306 = ((uStack_250 + uStack_f0) - (uStack_80 + uStack_1e0)) + uVar383;
        uVar309 = ((uStack_24e + uStack_ee) - (uStack_7e + uStack_1de)) + uVar323;
        uVar312 = ((uStack_24c + uStack_ec) - (uStack_7c + uStack_1dc)) + uVar367;
        uVar315 = ((uStack_24a + uStack_ea) - (uStack_7a + uStack_1da)) + uVar365;
        uVar362 = uVar362 >> 4;
        uVar364 = uVar364 >> 4;
        uVar381 = uVar381 >> 4;
        uVar320 = uVar320 >> 4;
        uVar383 = uVar383 >> 4;
        uVar323 = uVar323 >> 4;
        uVar367 = uVar367 >> 4;
        uVar365 = uVar365 >> 4;
        auVar333[1] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
        auVar333[0] = (uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 - (0xff < uVar318);
        auVar333[2] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
        auVar333[3] = (uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 - (0xff < uVar300);
        auVar333[4] = (uVar305 != 0) * (uVar305 < 0x100) * (char)uVar305 - (0xff < uVar305);
        auVar333[5] = (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373);
        auVar333[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
        auVar333[7] = (uVar336 != 0) * (uVar336 < 0x100) * (char)uVar336 - (0xff < uVar336);
        auVar333[8] = (uVar362 != 0) * (uVar362 < 0x100) * (char)uVar362 - (0xff < uVar362);
        auVar333[9] = (uVar364 != 0) * (uVar364 < 0x100) * (char)uVar364 - (0xff < uVar364);
        auVar333[10] = (uVar381 != 0) * (uVar381 < 0x100) * (char)uVar381 - (0xff < uVar381);
        auVar333[0xb] = (uVar320 != 0) * (uVar320 < 0x100) * (char)uVar320 - (0xff < uVar320);
        auVar333[0xc] = (uVar383 != 0) * (uVar383 < 0x100) * (char)uVar383 - (0xff < uVar383);
        auVar333[0xd] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
        auVar333[0xe] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
        auVar333[0xf] = (uVar365 != 0) * (uVar365 < 0x100) * (char)uVar365 - (0xff < uVar365);
        *(undefined1 (*) [16])(s + lVar166 * -4) = ~auVar293 & auVar175 | auVar333 & auVar293;
        uVar233 = uVar233 >> 8;
        uVar318 = ((uVar207 + uVar361) - (uVar221 + uVar308)) + uVar379;
        uVar324 = ((sVar294 + auVar97._2_2_) - (sVar214 + sVar225)) + uVar370;
        uVar305 = ((sVar295 + auVar131._0_2_) - (sVar215 + sVar227)) + uVar349;
        uVar381 = ((sVar296 + sVar262) - (sVar216 + sVar228)) + uVar351;
        uVar320 = ((sVar297 + auVar83._8_2_) - (sVar217 + sVar229)) + uVar353;
        uVar383 = ((sVar298 + auVar55._10_2_) - (sVar218 + sVar230)) + uVar356;
        uVar323 = ((sVar299 + auVar27._12_2_) - (sVar220 + sVar232)) + uVar334;
        uVar367 = (((uVar169 >> 8) + uVar191) - (uVar170 + uVar233)) + uVar368;
        uVar379 = uVar379 >> 4;
        uVar370 = uVar370 >> 4;
        uVar349 = uVar349 >> 4;
        uVar351 = uVar351 >> 4;
        uVar353 = uVar353 >> 4;
        uVar356 = uVar356 >> 4;
        uVar334 = uVar334 >> 4;
        uVar368 = uVar368 >> 4;
        uVar372 = ((uVar197 + auVar266[8]) - (uVar231 + uVar317)) + uVar187;
        uVar374 = ((uStack_236 + auVar266[9]) - (uStack_136 + uStack_1e6)) + uVar205;
        uVar376 = ((uStack_234 + auVar266[10]) - (uStack_134 + uStack_1e4)) + uVar212;
        uVar378 = ((uStack_232 + auVar266[0xb]) - (uStack_132 + uStack_1e2)) + uVar202;
        uVar380 = ((uStack_230 + auVar266[0xc]) - (uStack_130 + uStack_1e0)) + uVar306;
        uVar382 = ((uStack_22e + auVar266[0xd]) - (uStack_12e + uStack_1de)) + uVar309;
        uVar338 = ((uStack_22c + auVar266[0xe]) - (uStack_12c + uStack_1dc)) + uVar312;
        uVar343 = ((uStack_22a + auVar266[0xf]) - (uStack_12a + uStack_1da)) + uVar315;
        uVar187 = uVar187 >> 4;
        uVar205 = uVar205 >> 4;
        uVar212 = uVar212 >> 4;
        uVar202 = uVar202 >> 4;
        uVar306 = uVar306 >> 4;
        uVar309 = uVar309 >> 4;
        uVar312 = uVar312 >> 4;
        uVar315 = uVar315 >> 4;
        auVar341[1] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
        auVar341[0] = (uVar379 != 0) * (uVar379 < 0x100) * (char)uVar379 - (0xff < uVar379);
        auVar341[2] = (uVar349 != 0) * (uVar349 < 0x100) * (char)uVar349 - (0xff < uVar349);
        auVar341[3] = (uVar351 != 0) * (uVar351 < 0x100) * (char)uVar351 - (0xff < uVar351);
        auVar341[4] = (uVar353 != 0) * (uVar353 < 0x100) * (char)uVar353 - (0xff < uVar353);
        auVar341[5] = (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356);
        auVar341[6] = (uVar334 != 0) * (uVar334 < 0x100) * (char)uVar334 - (0xff < uVar334);
        auVar341[7] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
        auVar341[8] = (uVar187 != 0) * (uVar187 < 0x100) * (char)uVar187 - (0xff < uVar187);
        auVar341[9] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
        auVar341[10] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
        auVar341[0xb] = (uVar202 != 0) * (uVar202 < 0x100) * (char)uVar202 - (0xff < uVar202);
        auVar341[0xc] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
        auVar341[0xd] = (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309);
        auVar341[0xe] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
        auVar341[0xf] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
        *(undefined1 (*) [16])(s + lVar166 * -3) = ~auVar293 & auVar172 | auVar341 & auVar293;
        uVar205 = ((uVar208 + uVar311) - (uVar360 + uVar308)) + uVar318;
        uVar202 = ((sVar326 + sStack_266) - (sVar342 + sVar225)) + uVar324;
        uVar309 = ((sVar327 + sStack_264) - (sVar344 + sVar227)) + uVar305;
        uVar315 = ((sVar328 + sStack_262) - (sVar346 + sVar228)) + uVar381;
        uVar321 = ((sVar329 + sStack_260) - (sVar348 + sVar229)) + uVar320;
        uVar300 = ((sVar330 + sStack_25e) - (sVar350 + sVar230)) + uVar383;
        uVar373 = ((sVar331 + sStack_25c) - (sVar352 + sVar232)) + uVar323;
        uVar379 = ((uVar183 + uVar195) - (uVar184 + uVar233)) + uVar367;
        uVar318 = uVar318 >> 4;
        uVar324 = uVar324 >> 4;
        uVar305 = uVar305 >> 4;
        uVar381 = uVar381 >> 4;
        uVar320 = uVar320 >> 4;
        uVar383 = uVar383 >> 4;
        uVar323 = uVar323 >> 4;
        uVar367 = uVar367 >> 4;
        uVar370 = ((uVar219 + auVar340[8]) - (uVar253 + uVar317)) + uVar372;
        uVar349 = ((uStack_2a6 + uStack_2c6) - (uStack_246 + uStack_1e6)) + uVar374;
        uVar351 = ((uStack_2a4 + uStack_2c4) - (uStack_244 + uStack_1e4)) + uVar376;
        uVar353 = ((uStack_2a2 + uStack_2c2) - (uStack_242 + uStack_1e2)) + uVar378;
        uVar356 = ((uStack_2a0 + uStack_2c0) - (uStack_240 + uStack_1e0)) + uVar380;
        uVar334 = ((uStack_29e + uStack_2be) - (uStack_23e + uStack_1de)) + uVar382;
        uVar368 = ((uStack_29c + uStack_2bc) - (uStack_23c + uStack_1dc)) + uVar338;
        uVar371 = ((uStack_29a + uStack_2ba) - (uStack_23a + uStack_1da)) + uVar343;
        uVar372 = uVar372 >> 4;
        uVar374 = uVar374 >> 4;
        uVar376 = uVar376 >> 4;
        uVar378 = uVar378 >> 4;
        uVar380 = uVar380 >> 4;
        uVar382 = uVar382 >> 4;
        uVar338 = uVar338 >> 4;
        uVar343 = uVar343 >> 4;
        auVar268[1] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
        auVar268[0] = (uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 - (0xff < uVar318);
        auVar268[2] = (uVar305 != 0) * (uVar305 < 0x100) * (char)uVar305 - (0xff < uVar305);
        auVar268[3] = (uVar381 != 0) * (uVar381 < 0x100) * (char)uVar381 - (0xff < uVar381);
        auVar268[4] = (uVar320 != 0) * (uVar320 < 0x100) * (char)uVar320 - (0xff < uVar320);
        auVar268[5] = (uVar383 != 0) * (uVar383 < 0x100) * (char)uVar383 - (0xff < uVar383);
        auVar268[6] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
        auVar268[7] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
        auVar268[8] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
        auVar268[9] = (uVar374 != 0) * (uVar374 < 0x100) * (char)uVar374 - (0xff < uVar374);
        auVar268[10] = (uVar376 != 0) * (uVar376 < 0x100) * (char)uVar376 - (0xff < uVar376);
        auVar268[0xb] = (uVar378 != 0) * (uVar378 < 0x100) * (char)uVar378 - (0xff < uVar378);
        auVar268[0xc] = (uVar380 != 0) * (uVar380 < 0x100) * (char)uVar380 - (0xff < uVar380);
        auVar268[0xd] = (uVar382 != 0) * (uVar382 < 0x100) * (char)uVar382 - (0xff < uVar382);
        auVar268[0xe] = (uVar338 != 0) * (uVar338 < 0x100) * (char)uVar338 - (0xff < uVar338);
        auVar268[0xf] = (uVar343 != 0) * (uVar343 < 0x100) * (char)uVar343 - (0xff < uVar343);
        *(undefined1 (*) [16])(s + lVar165) = ~auVar293 & auVar171 | auVar268 & auVar293;
        uVar187 = ((uVar223 + uVar377) - (uVar308 + uVar235)) + uVar205;
        uVar212 = ((sStack_296 + sStack_76) - (sVar225 + sVar256)) + uVar202;
        uVar306 = ((sStack_294 + sStack_74) - (sVar227 + sVar257)) + uVar309;
        uVar312 = ((sStack_292 + sStack_72) - (sVar228 + sVar258)) + uVar315;
        uVar318 = ((sStack_290 + sStack_70) - (sVar229 + sVar259)) + uVar321;
        uVar324 = ((sStack_28e + sStack_6e) - (sVar230 + sVar260)) + uVar300;
        uVar305 = ((sStack_28c + sStack_6c) - (sVar232 + sVar261)) + uVar373;
        uVar308 = ((uVar209 + uVar200) - (uVar233 + uVar292)) + uVar379;
        uVar205 = uVar205 >> 4;
        uVar202 = uVar202 >> 4;
        uVar309 = uVar309 >> 4;
        uVar315 = uVar315 >> 4;
        uVar321 = uVar321 >> 4;
        uVar300 = uVar300 >> 4;
        uVar373 = uVar373 >> 4;
        uVar379 = uVar379 >> 4;
        uVar372 = ((uVar366 + uVar325) - (uVar317 + uVar222)) + uVar370;
        uVar374 = ((uStack_2b6 + uStack_1d6) - (uStack_1e6 + uStack_256)) + uVar349;
        uVar376 = ((uStack_2b4 + uStack_1d4) - (uStack_1e4 + uStack_254)) + uVar351;
        uVar378 = ((uStack_2b2 + uStack_1d2) - (uStack_1e2 + uStack_252)) + uVar353;
        uVar380 = ((uStack_2b0 + uStack_1d0) - (uStack_1e0 + uStack_250)) + uVar356;
        uVar382 = ((uStack_2ae + uStack_1ce) - (uStack_1de + uStack_24e)) + uVar334;
        uVar338 = ((uStack_2ac + uStack_1cc) - (uStack_1dc + uStack_24c)) + uVar368;
        uVar343 = ((uStack_2aa + uStack_1ca) - (uStack_1da + uStack_24a)) + uVar371;
        uVar370 = uVar370 >> 4;
        uVar349 = uVar349 >> 4;
        uVar351 = uVar351 >> 4;
        uVar353 = uVar353 >> 4;
        uVar356 = uVar356 >> 4;
        uVar334 = uVar334 >> 4;
        uVar368 = uVar368 >> 4;
        uVar371 = uVar371 >> 4;
        auVar255[1] = (uVar202 != 0) * (uVar202 < 0x100) * (char)uVar202 - (0xff < uVar202);
        auVar255[0] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
        auVar255[2] = (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309);
        auVar255[3] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
        auVar255[4] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
        auVar255[5] = (uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 - (0xff < uVar300);
        auVar255[6] = (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373);
        auVar255[7] = (uVar379 != 0) * (uVar379 < 0x100) * (char)uVar379 - (0xff < uVar379);
        auVar255[8] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
        auVar255[9] = (uVar349 != 0) * (uVar349 < 0x100) * (char)uVar349 - (0xff < uVar349);
        auVar255[10] = (uVar351 != 0) * (uVar351 < 0x100) * (char)uVar351 - (0xff < uVar351);
        auVar255[0xb] = (uVar353 != 0) * (uVar353 < 0x100) * (char)uVar353 - (0xff < uVar353);
        auVar255[0xc] = (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356);
        auVar255[0xd] = (uVar334 != 0) * (uVar334 < 0x100) * (char)uVar334 - (0xff < uVar334);
        auVar255[0xe] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
        auVar255[0xf] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
        *(undefined1 (*) [16])(s + lVar164) = ~auVar293 & auVar254 | auVar255 & auVar293;
        uVar233 = uVar187 >> 4;
        uVar205 = uVar212 >> 4;
        uVar202 = uVar306 >> 4;
        uVar309 = uVar312 >> 4;
        uVar315 = uVar318 >> 4;
        uVar321 = uVar324 >> 4;
        uVar300 = uVar305 >> 4;
        uVar373 = uVar308 >> 4;
        uVar379 = uVar372 >> 4;
        uVar317 = uVar374 >> 4;
        uVar381 = uVar376 >> 4;
        uVar320 = uVar378 >> 4;
        uVar383 = uVar380 >> 4;
        uVar323 = uVar382 >> 4;
        uVar367 = uVar338 >> 4;
        uVar370 = uVar343 >> 4;
        auVar175[1] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
        auVar175[0] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
        auVar175[2] = (uVar202 != 0) * (uVar202 < 0x100) * (char)uVar202 - (0xff < uVar202);
        auVar175[3] = (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309);
        auVar175[4] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
        auVar175[5] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
        auVar175[6] = (uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 - (0xff < uVar300);
        auVar175[7] = (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373);
        auVar175[8] = (uVar379 != 0) * (uVar379 < 0x100) * (char)uVar379 - (0xff < uVar379);
        auVar175[9] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
        auVar175[10] = (uVar381 != 0) * (uVar381 < 0x100) * (char)uVar381 - (0xff < uVar381);
        auVar175[0xb] = (uVar320 != 0) * (uVar320 < 0x100) * (char)uVar320 - (0xff < uVar320);
        auVar175[0xc] = (uVar383 != 0) * (uVar383 < 0x100) * (char)uVar383 - (0xff < uVar383);
        auVar175[0xd] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
        auVar175[0xe] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
        auVar175[0xf] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
        *(undefined1 (*) [16])s = ~auVar293 & auVar173 | auVar175 & auVar293;
        uVar187 = (uVar226 - (uVar345 + uVar207)) + uVar377 + uVar187;
        uVar212 = (sStack_226 - (sVar286 + sVar294)) + sStack_76 + uVar212;
        uVar306 = (sStack_224 - (sVar287 + sVar295)) + sStack_74 + uVar306;
        uVar312 = (sStack_222 - (sVar288 + sVar296)) + sStack_72 + uVar312;
        uVar318 = (sStack_220 - (sVar289 + sVar297)) + sStack_70 + uVar318;
        uVar324 = (sStack_21e - (sVar290 + sVar298)) + sStack_6e + uVar324;
        uVar305 = (sStack_21c - (sVar291 + sVar299)) + sStack_6c + uVar305;
        uVar308 = (uVar168 - ((uVar301 >> 8) + (uVar169 >> 8))) + uVar200 + uVar308;
        uVar372 = (uVar337 - (uVar314 + uVar197)) + uVar325 + uVar372;
        uVar374 = (uStack_196 - (uStack_186 + uStack_236)) + uStack_1d6 + uVar374;
        uVar376 = (uStack_194 - (uStack_184 + uStack_234)) + uStack_1d4 + uVar376;
        uVar378 = (uStack_192 - (uStack_182 + uStack_232)) + uStack_1d2 + uVar378;
        uVar380 = (uStack_190 - (uStack_180 + uStack_230)) + uStack_1d0 + uVar380;
        uVar382 = (uStack_18e - (uStack_17e + uStack_22e)) + uStack_1ce + uVar382;
        uVar338 = (uStack_18c - (uStack_17c + uStack_22c)) + uStack_1cc + uVar338;
        uVar343 = (uStack_18a - (uStack_17a + uStack_22a)) + uStack_1ca + uVar343;
        uVar169 = uVar187 >> 4;
        uVar233 = uVar212 >> 4;
        uVar301 = uVar306 >> 4;
        uVar205 = uVar312 >> 4;
        uVar197 = uVar318 >> 4;
        uVar202 = uVar324 >> 4;
        uVar207 = uVar305 >> 4;
        uVar309 = uVar308 >> 4;
        uVar315 = uVar372 >> 4;
        uVar321 = uVar374 >> 4;
        uVar300 = uVar376 >> 4;
        uVar373 = uVar378 >> 4;
        uVar314 = uVar380 >> 4;
        uVar379 = uVar382 >> 4;
        uVar317 = uVar338 >> 4;
        uVar381 = uVar343 >> 4;
        auVar176[1] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
        auVar176[0] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        auVar176[2] = (uVar301 != 0) * (uVar301 < 0x100) * (char)uVar301 - (0xff < uVar301);
        auVar176[3] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
        auVar176[4] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
        auVar176[5] = (uVar202 != 0) * (uVar202 < 0x100) * (char)uVar202 - (0xff < uVar202);
        auVar176[6] = (uVar207 != 0) * (uVar207 < 0x100) * (char)uVar207 - (0xff < uVar207);
        auVar176[7] = (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309);
        auVar176[8] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
        auVar176[9] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
        auVar176[10] = (uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 - (0xff < uVar300);
        auVar176[0xb] = (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373);
        auVar176[0xc] = (uVar314 != 0) * (uVar314 < 0x100) * (char)uVar314 - (0xff < uVar314);
        auVar176[0xd] = (uVar379 != 0) * (uVar379 < 0x100) * (char)uVar379 - (0xff < uVar379);
        auVar176[0xe] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
        auVar176[0xf] = (uVar381 != 0) * (uVar381 < 0x100) * (char)uVar381 - (0xff < uVar381);
        *(undefined1 (*) [16])(s + lVar166) = ~auVar293 & auVar224 | auVar176 & auVar293;
        uVar187 = (uVar264 - (uVar375 + uVar208)) + uVar377 + uVar187;
        uVar212 = (sStack_e6 - (sVar355 + sVar326)) + sStack_76 + uVar212;
        uVar306 = (sStack_e4 - (sVar188 + sVar327)) + sStack_74 + uVar306;
        uVar312 = (sStack_e2 - (sVar192 + sVar328)) + sStack_72 + uVar312;
        uVar318 = (sStack_e0 - (sVar196 + sVar329)) + sStack_70 + uVar318;
        uVar324 = (sStack_de - (sVar201 + sVar330)) + sStack_6e + uVar324;
        uVar305 = (sStack_dc - (sVar206 + sVar331)) + sStack_6c + uVar305;
        uVar308 = (uVar358 - ((uVar182 >> 8) + uVar183)) + uVar200 + uVar308;
        uVar372 = (uVar252 - (uVar347 + uVar219)) + uVar325 + uVar372;
        uVar374 = (uStack_f6 - (uStack_86 + uStack_2a6)) + uStack_1d6 + uVar374;
        uVar376 = (uStack_f4 - (uStack_84 + uStack_2a4)) + uStack_1d4 + uVar376;
        uVar378 = (uStack_f2 - (uStack_82 + uStack_2a2)) + uStack_1d2 + uVar378;
        uVar380 = (uStack_f0 - (uStack_80 + uStack_2a0)) + uStack_1d0 + uVar380;
        uVar382 = (uStack_ee - (uStack_7e + uStack_29e)) + uStack_1ce + uVar382;
        uVar338 = (uStack_ec - (uStack_7c + uStack_29c)) + uStack_1cc + uVar338;
        uVar343 = (uStack_ea - (uStack_7a + uStack_29a)) + uStack_1ca + uVar343;
        uVar169 = uVar187 >> 4;
        uVar183 = uVar212 >> 4;
        uVar233 = uVar306 >> 4;
        uVar301 = uVar312 >> 4;
        uVar182 = uVar318 >> 4;
        uVar205 = uVar324 >> 4;
        uVar208 = uVar305 >> 4;
        uVar197 = uVar308 >> 4;
        uVar202 = uVar372 >> 4;
        uVar207 = uVar374 >> 4;
        uVar309 = uVar376 >> 4;
        uVar315 = uVar378 >> 4;
        uVar321 = uVar380 >> 4;
        uVar219 = uVar382 >> 4;
        uVar300 = uVar338 >> 4;
        uVar373 = uVar343 >> 4;
        auVar177[1] = (uVar183 != 0) * (uVar183 < 0x100) * (char)uVar183 - (0xff < uVar183);
        auVar177[0] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        auVar177[2] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
        auVar177[3] = (uVar301 != 0) * (uVar301 < 0x100) * (char)uVar301 - (0xff < uVar301);
        auVar177[4] = (uVar182 != 0) * (uVar182 < 0x100) * (char)uVar182 - (0xff < uVar182);
        auVar177[5] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
        auVar177[6] = (uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 - (0xff < uVar208);
        auVar177[7] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
        auVar177[8] = (uVar202 != 0) * (uVar202 < 0x100) * (char)uVar202 - (0xff < uVar202);
        auVar177[9] = (uVar207 != 0) * (uVar207 < 0x100) * (char)uVar207 - (0xff < uVar207);
        auVar177[10] = (uVar309 != 0) * (uVar309 < 0x100) * (char)uVar309 - (0xff < uVar309);
        auVar177[0xb] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
        auVar177[0xc] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
        auVar177[0xd] = (uVar219 != 0) * (uVar219 < 0x100) * (char)uVar219 - (0xff < uVar219);
        auVar177[0xe] = (uVar300 != 0) * (uVar300 < 0x100) * (char)uVar300 - (0xff < uVar300);
        auVar177[0xf] = (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373);
        *(undefined1 (*) [16])(s + lVar166 * 2) = ~auVar293 & auVar236 | auVar177 & auVar293;
        uVar187 = (uVar361 - (uVar223 + uVar221)) + uVar377 + uVar187;
        uVar212 = (auVar97._2_2_ - (sStack_296 + sVar214)) + sStack_76 + uVar212;
        uVar306 = (auVar131._0_2_ - (sStack_294 + sVar215)) + sStack_74 + uVar306;
        uVar312 = (sVar262 - (sStack_292 + sVar216)) + sStack_72 + uVar312;
        uVar318 = (auVar83._8_2_ - (sStack_290 + sVar217)) + sStack_70 + uVar318;
        uVar324 = (auVar55._10_2_ - (sStack_28e + sVar218)) + sStack_6e + uVar324;
        uVar305 = (auVar27._12_2_ - (sStack_28c + sVar220)) + sStack_6c + uVar305;
        uVar308 = (uVar191 - (uVar209 + uVar170)) + uVar200 + uVar308;
        uVar372 = ((ushort)auVar266[8] - (uVar366 + uVar231)) + uVar325 + uVar372;
        uVar374 = ((ushort)auVar266[9] - (uStack_2b6 + uStack_136)) + uStack_1d6 + uVar374;
        uVar376 = ((ushort)auVar266[10] - (uStack_2b4 + uStack_134)) + uStack_1d4 + uVar376;
        uVar378 = ((ushort)auVar266[0xb] - (uStack_2b2 + uStack_132)) + uStack_1d2 + uVar378;
        uVar380 = ((ushort)auVar266[0xc] - (uStack_2b0 + uStack_130)) + uStack_1d0 + uVar380;
        uVar382 = ((ushort)auVar266[0xd] - (uStack_2ae + uStack_12e)) + uStack_1ce + uVar382;
        uVar338 = ((ushort)auVar266[0xe] - (uStack_2ac + uStack_12c)) + uStack_1cc + uVar338;
        uVar343 = ((ushort)auVar266[0xf] - (uStack_2aa + uStack_12a)) + uStack_1ca + uVar343;
        uVar223 = (uVar311 - (uVar360 + uVar226)) + uVar377 + uVar187;
        uVar226 = (sStack_266 - (sVar342 + sStack_226)) + sStack_76 + uVar212;
        uVar197 = (sStack_264 - (sVar344 + sStack_224)) + sStack_74 + uVar306;
        uVar202 = (sStack_262 - (sVar346 + sStack_222)) + sStack_72 + uVar312;
        uVar207 = (sStack_260 - (sVar348 + sStack_220)) + sStack_70 + uVar318;
        uVar231 = (sStack_25e - (sVar350 + sStack_21e)) + sStack_6e + uVar324;
        uVar309 = (sStack_25c - (sVar352 + sStack_21c)) + sStack_6c + uVar305;
        uVar315 = (uVar195 - (uVar184 + uVar168)) + uVar200 + uVar308;
        uVar187 = uVar187 >> 4;
        uVar212 = uVar212 >> 4;
        uVar306 = uVar306 >> 4;
        uVar312 = uVar312 >> 4;
        uVar318 = uVar318 >> 4;
        uVar324 = uVar324 >> 4;
        uVar305 = uVar305 >> 4;
        uVar308 = uVar308 >> 4;
        uVar253 = ((ushort)auVar340[8] - (uVar253 + uVar337)) + uVar325 + uVar372;
        uVar321 = (uStack_2c6 - (uStack_246 + uStack_196)) + uStack_1d6 + uVar374;
        uVar219 = (uStack_2c4 - (uStack_244 + uStack_194)) + uStack_1d4 + uVar376;
        uVar300 = (uStack_2c2 - (uStack_242 + uStack_192)) + uStack_1d2 + uVar378;
        uVar373 = (uStack_2c0 - (uStack_240 + uStack_190)) + uStack_1d0 + uVar380;
        uVar375 = (uStack_2be - (uStack_23e + uStack_18e)) + uStack_1ce + uVar382;
        uVar311 = (uStack_2bc - (uStack_23c + uStack_18c)) + uStack_1cc + uVar338;
        uVar314 = (uStack_2ba - (uStack_23a + uStack_18a)) + uStack_1ca + uVar343;
        uVar372 = uVar372 >> 4;
        uVar374 = uVar374 >> 4;
        uVar376 = uVar376 >> 4;
        uVar378 = uVar378 >> 4;
        uVar380 = uVar380 >> 4;
        uVar382 = uVar382 >> 4;
        uVar338 = uVar338 >> 4;
        uVar343 = uVar343 >> 4;
        auVar178[1] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
        auVar178[0] = (uVar187 != 0) * (uVar187 < 0x100) * (char)uVar187 - (0xff < uVar187);
        auVar178[2] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
        auVar178[3] = (uVar312 != 0) * (uVar312 < 0x100) * (char)uVar312 - (0xff < uVar312);
        auVar178[4] = (uVar318 != 0) * (uVar318 < 0x100) * (char)uVar318 - (0xff < uVar318);
        auVar178[5] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
        auVar178[6] = (uVar305 != 0) * (uVar305 < 0x100) * (char)uVar305 - (0xff < uVar305);
        auVar178[7] = (uVar308 != 0) * (uVar308 < 0x100) * (char)uVar308 - (0xff < uVar308);
        auVar178[8] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
        auVar178[9] = (uVar374 != 0) * (uVar374 < 0x100) * (char)uVar374 - (0xff < uVar374);
        auVar178[10] = (uVar376 != 0) * (uVar376 < 0x100) * (char)uVar376 - (0xff < uVar376);
        auVar178[0xb] = (uVar378 != 0) * (uVar378 < 0x100) * (char)uVar378 - (0xff < uVar378);
        auVar178[0xc] = (uVar380 != 0) * (uVar380 < 0x100) * (char)uVar380 - (0xff < uVar380);
        auVar178[0xd] = (uVar382 != 0) * (uVar382 < 0x100) * (char)uVar382 - (0xff < uVar382);
        auVar178[0xe] = (uVar338 != 0) * (uVar338 < 0x100) * (char)uVar338 - (0xff < uVar338);
        auVar178[0xf] = (uVar343 != 0) * (uVar343 < 0x100) * (char)uVar343 - (0xff < uVar343);
        *(undefined1 (*) [16])(s + lVar166 * 3) = ~auVar293 & auVar179 | auVar178 & auVar293;
        uVar170 = uVar223 >> 4;
        uVar184 = uVar226 >> 4;
        uVar169 = uVar197 >> 4;
        uVar183 = uVar202 >> 4;
        uVar233 = uVar207 >> 4;
        uVar301 = uVar231 >> 4;
        uVar209 = uVar309 >> 4;
        uVar168 = uVar315 >> 4;
        uVar182 = uVar253 >> 4;
        uVar187 = uVar321 >> 4;
        uVar191 = uVar219 >> 4;
        uVar195 = uVar300 >> 4;
        uVar205 = uVar373 >> 4;
        uVar212 = uVar375 >> 4;
        uVar221 = uVar311 >> 4;
        uVar208 = uVar314 >> 4;
        auVar179[1] = (uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184);
        auVar179[0] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
        auVar179[2] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        auVar179[3] = (uVar183 != 0) * (uVar183 < 0x100) * (char)uVar183 - (0xff < uVar183);
        auVar179[4] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
        auVar179[5] = (uVar301 != 0) * (uVar301 < 0x100) * (char)uVar301 - (0xff < uVar301);
        auVar179[6] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
        auVar179[7] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
        auVar179[8] = (uVar182 != 0) * (uVar182 < 0x100) * (char)uVar182 - (0xff < uVar182);
        auVar179[9] = (uVar187 != 0) * (uVar187 < 0x100) * (char)uVar187 - (0xff < uVar187);
        auVar179[10] = (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 - (0xff < uVar191);
        auVar179[0xb] = (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar195 - (0xff < uVar195);
        auVar179[0xc] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
        auVar179[0xd] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
        auVar179[0xe] = (uVar221 != 0) * (uVar221 < 0x100) * (char)uVar221 - (0xff < uVar221);
        auVar179[0xf] = (uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 - (0xff < uVar208);
        *(undefined1 (*) [16])(s + lVar166 * 4) = ~auVar293 & auVar266 | auVar179 & auVar293;
        uVar170 = (ushort)((uVar377 * 2 - (uVar235 + uVar264)) + uVar223) >> 4;
        uVar184 = (ushort)((sStack_76 * 2 - (sVar256 + sStack_e6)) + uVar226) >> 4;
        uVar169 = (ushort)((sStack_74 * 2 - (sVar257 + sStack_e4)) + uVar197) >> 4;
        uVar183 = (ushort)((sStack_72 * 2 - (sVar258 + sStack_e2)) + uVar202) >> 4;
        uVar233 = (ushort)((sStack_70 * 2 - (sVar259 + sStack_e0)) + uVar207) >> 4;
        uVar301 = (ushort)((sStack_6e * 2 - (sVar260 + sStack_de)) + uVar231) >> 4;
        uVar209 = (ushort)((sStack_6c * 2 - (sVar261 + sStack_dc)) + uVar309) >> 4;
        uVar292 = (ushort)((uVar200 * 2 - (uVar292 + uVar358)) + uVar315) >> 4;
        uVar358 = (ushort)((uVar325 * 2 - (uVar222 + uVar252)) + uVar253) >> 4;
        uVar168 = (ushort)((uStack_1d6 * 2 - (uStack_256 + uStack_f6)) + uVar321) >> 4;
        uVar182 = (ushort)((uStack_1d4 * 2 - (uStack_254 + uStack_f4)) + uVar219) >> 4;
        uVar187 = (ushort)((uStack_1d2 * 2 - (uStack_252 + uStack_f2)) + uVar300) >> 4;
        uVar191 = (ushort)((uStack_1d0 * 2 - (uStack_250 + uStack_f0)) + uVar373) >> 4;
        uVar195 = (ushort)((uStack_1ce * 2 - (uStack_24e + uStack_ee)) + uVar375) >> 4;
        uVar200 = (ushort)((uStack_1cc * 2 - (uStack_24c + uStack_ec)) + uVar311) >> 4;
        uVar205 = (ushort)((uStack_1ca * 2 - (uStack_24a + uStack_ea)) + uVar314) >> 4;
        auVar285[1] = (uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184);
        auVar285[0] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
        auVar285[2] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        auVar285[3] = (uVar183 != 0) * (uVar183 < 0x100) * (char)uVar183 - (0xff < uVar183);
        auVar285[4] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
        auVar285[5] = (uVar301 != 0) * (uVar301 < 0x100) * (char)uVar301 - (0xff < uVar301);
        auVar285[6] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
        auVar285[7] = (uVar292 != 0) * (uVar292 < 0x100) * (char)uVar292 - (0xff < uVar292);
        auVar285[8] = (uVar358 != 0) * (uVar358 < 0x100) * (char)uVar358 - (0xff < uVar358);
        auVar285[9] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
        auVar285[10] = (uVar182 != 0) * (uVar182 < 0x100) * (char)uVar182 - (0xff < uVar182);
        auVar285[0xb] = (uVar187 != 0) * (uVar187 < 0x100) * (char)uVar187 - (0xff < uVar187);
        auVar285[0xc] = (uVar191 != 0) * (uVar191 < 0x100) * (char)uVar191 - (0xff < uVar191);
        auVar285[0xd] = (uVar195 != 0) * (uVar195 < 0x100) * (char)uVar195 - (0xff < uVar195);
        auVar285[0xe] = (uVar200 != 0) * (uVar200 < 0x100) * (char)uVar200 - (0xff < uVar200);
        auVar285[0xf] = (uVar205 != 0) * (uVar205 < 0x100) * (char)uVar205 - (0xff < uVar205);
        *(undefined1 (*) [16])(s + lVar166 * 5) = ~auVar293 & auVar340 | auVar285 & auVar293;
      }
    }
  }
  return;
}

Assistant:

void aom_lpf_horizontal_14_quad_sse2(unsigned char *s, int p,
                                     const unsigned char *_blimit0,
                                     const unsigned char *_limit0,
                                     const unsigned char *_thresh0) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi8(1);
  const __m128i blimit_v = _mm_load_si128((const __m128i *)_blimit0);
  const __m128i limit_v = _mm_load_si128((const __m128i *)_limit0);
  const __m128i thresh_v = _mm_load_si128((const __m128i *)_thresh0);
  __m128i mask, hev, flat, flat2;
  __m128i p6, p5;
  __m128i p4, p3, p2, p1, p0, q0, q1, q2, q3, q4;
  __m128i q6, q5;

  __m128i op2, op1, op0, oq0, oq1, oq2;

  __m128i max_abs_p1p0q1q0;

  p6 = _mm_loadu_si128((__m128i *)(s - 7 * p));
  p5 = _mm_loadu_si128((__m128i *)(s - 6 * p));
  p4 = _mm_loadu_si128((__m128i *)(s - 5 * p));
  p3 = _mm_loadu_si128((__m128i *)(s - 4 * p));
  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s - 0 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));
  q3 = _mm_loadu_si128((__m128i *)(s + 3 * p));
  q4 = _mm_loadu_si128((__m128i *)(s + 4 * p));
  q5 = _mm_loadu_si128((__m128i *)(s + 5 * p));
  q6 = _mm_loadu_si128((__m128i *)(s + 6 * p));

  {
    const __m128i abs_p1p0 = abs_diff(p1, p0);
    const __m128i abs_q1q0 = abs_diff(q1, q0);
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i ff = _mm_cmpeq_epi8(zero, zero);
    __m128i abs_p0q0 = abs_diff(p0, q0);
    __m128i abs_p1q1 = abs_diff(p1, q1);
    __m128i work;
    max_abs_p1p0q1q0 = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(max_abs_p1p0q1q0, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    work = _mm_max_epu8(abs_diff(p2, p1), abs_diff(p3, p2));
    mask = _mm_max_epu8(work, mask);
    work = _mm_max_epu8(abs_diff(q2, q1), abs_diff(q3, q2));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  {
    __m128i work;
    work = _mm_max_epu8(abs_diff(p2, p0), abs_diff(q2, q0));
    flat = _mm_max_epu8(work, max_abs_p1p0q1q0);
    work = _mm_max_epu8(abs_diff(p3, p0), abs_diff(q3, q0));
    flat = _mm_max_epu8(work, flat);
    work = _mm_max_epu8(abs_diff(p4, p0), abs_diff(q4, q0));
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);
    flat2 = _mm_max_epu8(abs_diff(p5, p0), abs_diff(q5, q0));
    flat2 = _mm_max_epu8(work, flat2);
    work = _mm_max_epu8(abs_diff(p6, p0), abs_diff(q6, q0));
    flat2 = _mm_max_epu8(work, flat2);
    flat2 = _mm_subs_epu8(flat2, one);
    flat2 = _mm_cmpeq_epi8(flat2, zero);
    flat2 = _mm_and_si128(flat2, flat);  // flat2 & flat & mask
  }

  // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
  // filter4
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i ff = _mm_cmpeq_epi8(t4, t4);

    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;

    op1 = _mm_xor_si128(p1, t80);
    op0 = _mm_xor_si128(p0, t80);
    oq0 = _mm_xor_si128(q0, t80);
    oq1 = _mm_xor_si128(q1, t80);

    hev = _mm_subs_epu8(max_abs_p1p0q1q0, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);
    filt = _mm_and_si128(_mm_subs_epi8(op1, oq1), hev);

    work_a = _mm_subs_epi8(oq0, op0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);
    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    oq0 = _mm_xor_si128(_mm_subs_epi8(oq0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    op0 = _mm_xor_si128(_mm_adds_epi8(op0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    op1 = _mm_xor_si128(_mm_adds_epi8(op1, filt), t80);
    oq1 = _mm_xor_si128(_mm_subs_epi8(oq1, filt), t80);

    // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
    // filter8
    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m128i four = _mm_set1_epi16(4);
      const __m128i p3_lo = _mm_unpacklo_epi8(p3, zero);
      const __m128i p2_lo = _mm_unpacklo_epi8(p2, zero);
      const __m128i p1_lo = _mm_unpacklo_epi8(p1, zero);
      const __m128i p0_lo = _mm_unpacklo_epi8(p0, zero);
      const __m128i q0_lo = _mm_unpacklo_epi8(q0, zero);
      const __m128i q1_lo = _mm_unpacklo_epi8(q1, zero);
      const __m128i q2_lo = _mm_unpacklo_epi8(q2, zero);
      const __m128i q3_lo = _mm_unpacklo_epi8(q3, zero);

      const __m128i p3_hi = _mm_unpackhi_epi8(p3, zero);
      const __m128i p2_hi = _mm_unpackhi_epi8(p2, zero);
      const __m128i p1_hi = _mm_unpackhi_epi8(p1, zero);
      const __m128i p0_hi = _mm_unpackhi_epi8(p0, zero);
      const __m128i q0_hi = _mm_unpackhi_epi8(q0, zero);
      const __m128i q1_hi = _mm_unpackhi_epi8(q1, zero);
      const __m128i q2_hi = _mm_unpackhi_epi8(q2, zero);
      const __m128i q3_hi = _mm_unpackhi_epi8(q3, zero);
      __m128i f8_lo, f8_hi;

      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, four),
                            _mm_add_epi16(p3_lo, p2_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, f8_lo),
                            _mm_add_epi16(p2_lo, p1_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p0_lo, q0_lo), f8_lo);

      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, four),
                            _mm_add_epi16(p3_hi, p2_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, f8_hi),
                            _mm_add_epi16(p2_hi, p1_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p0_hi, q0_hi), f8_hi);

      op2 = filter8_mask(&flat, &p2, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q1_lo, &p1_lo, &p2_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q1_hi, &p1_hi, &p2_hi, &p3_hi);
      op1 = filter8_mask(&flat, &op1, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q2_lo, &p0_lo, &p1_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q2_hi, &p0_hi, &p1_hi, &p3_hi);
      op0 = filter8_mask(&flat, &op0, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q0_lo, &p0_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q0_hi, &p0_hi, &p3_hi);
      oq0 = filter8_mask(&flat, &oq0, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q1_lo, &q0_lo, &p2_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q1_hi, &q0_hi, &p2_hi);
      oq1 = filter8_mask(&flat, &oq1, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q2_lo, &q1_lo, &p1_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q2_hi, &q1_hi, &p1_hi);
      oq2 = filter8_mask(&flat, &q2, &f8_lo, &f8_hi);

      // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
      // wide flat calculations
      if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat2, zero))) {
        const __m128i eight = _mm_set1_epi16(8);
        const __m128i p6_lo = _mm_unpacklo_epi8(p6, zero);
        const __m128i p5_lo = _mm_unpacklo_epi8(p5, zero);
        const __m128i p4_lo = _mm_unpacklo_epi8(p4, zero);
        const __m128i q4_lo = _mm_unpacklo_epi8(q4, zero);
        const __m128i q5_lo = _mm_unpacklo_epi8(q5, zero);
        const __m128i q6_lo = _mm_unpacklo_epi8(q6, zero);

        const __m128i p6_hi = _mm_unpackhi_epi8(p6, zero);
        const __m128i p5_hi = _mm_unpackhi_epi8(p5, zero);
        const __m128i p4_hi = _mm_unpackhi_epi8(p4, zero);
        const __m128i q4_hi = _mm_unpackhi_epi8(q4, zero);
        const __m128i q5_hi = _mm_unpackhi_epi8(q5, zero);
        const __m128i q6_hi = _mm_unpackhi_epi8(q6, zero);

        __m128i f_lo;
        __m128i f_hi;

        f_lo = _mm_sub_epi16(_mm_slli_epi16(p6_lo, 3), p6_lo);
        f_lo = _mm_add_epi16(_mm_slli_epi16(p5_lo, 1), f_lo);
        f_lo = _mm_add_epi16(_mm_slli_epi16(p4_lo, 1), f_lo);
        f_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, f_lo),
                             _mm_add_epi16(p2_lo, p1_lo));
        f_lo = _mm_add_epi16(_mm_add_epi16(p0_lo, q0_lo), f_lo);
        f_lo = _mm_add_epi16(f_lo, eight);

        f_hi = _mm_sub_epi16(_mm_slli_epi16(p6_hi, 3), p6_hi);
        f_hi = _mm_add_epi16(_mm_slli_epi16(p5_hi, 1), f_hi);
        f_hi = _mm_add_epi16(_mm_slli_epi16(p4_hi, 1), f_hi);
        f_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, f_hi),
                             _mm_add_epi16(p2_hi, p1_hi));
        f_hi = _mm_add_epi16(_mm_add_epi16(p0_hi, q0_hi), f_hi);
        f_hi = _mm_add_epi16(f_hi, eight);

        p5 = filter16_mask(&flat2, &p5, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 6 * p), p5);

        f_lo = filter_add2_sub2(&f_lo, &q1_lo, &p3_lo, &p6_lo, &p6_lo);
        f_hi = filter_add2_sub2(&f_hi, &q1_hi, &p3_hi, &p6_hi, &p6_hi);
        p4 = filter16_mask(&flat2, &p4, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 5 * p), p4);

        f_lo = filter_add2_sub2(&f_lo, &q2_lo, &p2_lo, &p6_lo, &p5_lo);
        f_hi = filter_add2_sub2(&f_hi, &q2_hi, &p2_hi, &p6_hi, &p5_hi);
        p3 = filter16_mask(&flat2, &p3, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 4 * p), p3);

        f_lo = filter_add2_sub2(&f_lo, &q3_lo, &p1_lo, &p6_lo, &p4_lo);
        f_hi = filter_add2_sub2(&f_hi, &q3_hi, &p1_hi, &p6_hi, &p4_hi);
        op2 = filter16_mask(&flat2, &op2, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 3 * p), op2);

        f_lo = filter_add2_sub2(&f_lo, &q4_lo, &p0_lo, &p6_lo, &p3_lo);
        f_hi = filter_add2_sub2(&f_hi, &q4_hi, &p0_hi, &p6_hi, &p3_hi);
        op1 = filter16_mask(&flat2, &op1, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 2 * p), op1);

        f_lo = filter_add2_sub2(&f_lo, &q5_lo, &q0_lo, &p6_lo, &p2_lo);
        f_hi = filter_add2_sub2(&f_hi, &q5_hi, &q0_hi, &p6_hi, &p2_hi);
        op0 = filter16_mask(&flat2, &op0, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 1 * p), op0);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q1_lo, &p6_lo, &p1_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q1_hi, &p6_hi, &p1_hi);
        oq0 = filter16_mask(&flat2, &oq0, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q2_lo, &p5_lo, &p0_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q2_hi, &p5_hi, &p0_hi);
        oq1 = filter16_mask(&flat2, &oq1, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q3_lo, &p4_lo, &q0_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q3_hi, &p4_hi, &q0_hi);
        oq2 = filter16_mask(&flat2, &oq2, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 2 * p), oq2);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q4_lo, &p3_lo, &q1_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q4_hi, &p3_hi, &q1_hi);
        q3 = filter16_mask(&flat2, &q3, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 3 * p), q3);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q5_lo, &p2_lo, &q2_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q5_hi, &p2_hi, &q2_hi);
        q4 = filter16_mask(&flat2, &q4, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 4 * p), q4);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q6_lo, &p1_lo, &q3_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q6_hi, &p1_hi, &q3_hi);
        q5 = filter16_mask(&flat2, &q5, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 5 * p), q5);
      } else {
        _mm_storeu_si128((__m128i *)(s - 3 * p), op2);
        _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
        _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
        _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
        _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
        _mm_storeu_si128((__m128i *)(s + 2 * p), oq2);
      }
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
    }
  }
}